

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2019.h
# Opt level: O1

void __thiscall Spaghetti<RemSP>::FirstScan(Spaghetti<RemSP> *this)

{
  char cVar1;
  Mat1b *pMVar2;
  Mat1i *pMVar3;
  uint *puVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  undefined4 uVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  uint uVar25;
  uint uVar26;
  long lVar27;
  int iVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  uint uVar35;
  ulong uVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  ulong local_b0;
  int local_a8;
  long lVar18;
  
  pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar25 = *(uint *)&pMVar2->field_0x8;
  uVar26 = *(uint *)&pMVar2->field_0xc;
  *(uint *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74 = uVar25 & 0xfffffffe;
  this->o_rows = (uVar25 & 0x80000001) == 1;
  this->e_cols = uVar26 & 0xfffffffe;
  this->o_cols = (uVar26 & 0x80000001) == 1;
  puVar4 = RemSP::P_;
  *RemSP::P_ = 0;
  RemSP::length_ = 1;
  lVar6 = *(long *)&pMVar2->field_0x10;
  if (uVar25 == 1) {
    lVar31 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
    lVar43 = (long)(int)uVar26 + -2;
    uVar25 = 0;
    iVar14 = (int)lVar43;
    if ((int)uVar26 < 3) {
LAB_001642ec:
      lVar43 = (long)(int)uVar25;
      if (iVar14 < (int)uVar25) {
        if (*(char *)(lVar6 + lVar43) == '\0') {
LAB_00164670:
          *(undefined4 *)(lVar31 + lVar43 * 4) = 0;
          return;
        }
      }
      else if (*(char *)(lVar6 + lVar43) == '\0') {
LAB_0016468f:
        lVar43 = (long)(int)uVar25;
        if (*(char *)(lVar6 + 1 + lVar43) != '\0') {
          puVar4[RemSP::length_] = RemSP::length_;
          uVar25 = RemSP::length_ + 1;
          *(uint *)(lVar31 + lVar43 * 4) = RemSP::length_;
          RemSP::length_ = uVar25;
          return;
        }
        *(undefined4 *)(lVar31 + lVar43 * 4) = 0;
        return;
      }
      puVar4[RemSP::length_] = RemSP::length_;
      uVar25 = RemSP::length_ + 1;
      *(uint *)(lVar31 + lVar43 * 4) = RemSP::length_;
      RemSP::length_ = uVar25;
      return;
    }
    uVar26 = 0xfffffffe;
    uVar25 = 0;
LAB_00164233:
    if (*(char *)(lVar6 + (int)uVar25) == '\0') goto LAB_00164261;
    cVar1 = *(char *)(lVar6 + 3 + (long)(int)uVar26);
    puVar4[RemSP::length_] = RemSP::length_;
    uVar26 = RemSP::length_ + 1;
    *(uint *)(lVar31 + (long)(int)uVar25 * 4) = RemSP::length_;
    RemSP::length_ = uVar26;
    uVar26 = uVar25;
    if (cVar1 == '\0') goto LAB_001642de;
    while (uVar26 = uVar25 + 2, (int)uVar26 < iVar14) {
      uVar11 = (long)(int)uVar25;
      uVar25 = uVar26;
      while (*(char *)(lVar6 + 2 + uVar11) != '\0') {
        if (*(char *)(lVar6 + 3 + uVar11) == '\0') {
          uVar12 = *(undefined4 *)(lVar31 + uVar11 * 4);
          lVar29 = uVar11 + 2;
          goto LAB_001642da;
        }
        *(undefined4 *)(lVar31 + 8 + uVar11 * 4) = *(undefined4 *)(lVar31 + uVar11 * 4);
        uVar36 = uVar11 + 2;
        lVar29 = uVar11 + 4;
        uVar25 = uVar25 + 2;
        uVar11 = uVar36;
        if (lVar43 <= lVar29) goto LAB_0016465c;
      }
LAB_00164261:
      lVar29 = (long)(int)uVar25;
      if (*(char *)(lVar6 + 1 + lVar29) == '\0') goto LAB_001642c5;
      puVar4[RemSP::length_] = RemSP::length_;
      uVar26 = RemSP::length_ + 1;
      *(uint *)(lVar31 + lVar29 * 4) = RemSP::length_;
      RemSP::length_ = uVar26;
    }
    uVar36 = (ulong)uVar25;
    uVar25 = uVar26;
LAB_0016465c:
    lVar43 = (long)(int)uVar25;
    if (iVar14 < (int)uVar25) {
      if (*(char *)(lVar6 + lVar43) == '\0') goto LAB_00164670;
    }
    else if (*(char *)(lVar6 + lVar43) == '\0') goto LAB_0016468f;
    *(undefined4 *)(lVar31 + lVar43 * 4) = *(undefined4 *)(lVar31 + (long)(int)uVar36 * 4);
    return;
  }
  lVar29 = **(long **)&pMVar2->field_0x48;
  lVar43 = lVar6 + lVar29;
  lVar45 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
  lVar31 = (long)(int)uVar26 + -2;
  uVar11 = 0;
  local_a8 = (int)lVar31;
  if (2 < (int)uVar26) {
    uVar11 = 0;
    do {
      if (*(char *)(lVar6 + (int)uVar11) != '\0') goto LAB_001644cd;
      if (*(char *)(lVar43 + (int)uVar11) != '\0') goto LAB_001644cd;
LAB_0016436f:
      iVar14 = (int)uVar11;
      uVar36 = (ulong)iVar14;
      if ((*(char *)(uVar36 + 1 + lVar6) != '\0') || (*(char *)(lVar43 + 1 + uVar36) != '\0')) {
        puVar4[RemSP::length_] = RemSP::length_;
        uVar35 = RemSP::length_;
        RemSP::length_ = RemSP::length_ + 1;
LAB_0016439a:
        *(uint *)(lVar45 + uVar36 * 4) = uVar35;
LAB_001643be:
        lVar37 = (long)(int)uVar11;
        uVar11 = lVar37 + 2;
        if ((int)uVar11 < local_a8) {
          if ((*(char *)(lVar6 + uVar11) != '\0') || (*(char *)(lVar43 + uVar11) != '\0')) {
LAB_001643db:
            lVar37 = (long)(int)uVar11;
            cVar1 = *(char *)(lVar6 + 1 + lVar37);
            *(undefined4 *)(lVar45 + lVar37 * 4) = *(undefined4 *)(lVar45 + -8 + lVar37 * 4);
            if (cVar1 == '\0') {
              do {
                iVar14 = (int)uVar11;
                uVar35 = iVar14 + 2;
                if (local_a8 <= (int)uVar35) {
LAB_00164550:
                  uVar11 = (ulong)uVar35;
                  lVar31 = (long)(int)uVar35;
                  if (local_a8 < (int)uVar35) {
                    if ((*(char *)(lVar6 + lVar31) == '\0') && (*(char *)(lVar43 + lVar31) == '\0'))
                    goto LAB_00164572;
                  }
                  else {
                    if (*(char *)(lVar6 + lVar31) != '\0') {
                      if (*(char *)(lVar43 + 1 + (long)iVar14) != '\0') goto LAB_001646d0;
                      goto LAB_001645c7;
                    }
                    if (*(char *)(lVar43 + lVar31) == '\0') goto LAB_001646dc;
                  }
                  if (*(char *)(lVar43 + 1 + (long)iVar14) == '\0') goto LAB_00164606;
                  *(undefined4 *)(lVar45 + lVar31 * 4) = *(undefined4 *)(lVar45 + (long)iVar14 * 4);
                  goto LAB_00164707;
                }
                lVar44 = (long)iVar14;
                lVar37 = lVar44 + 2;
                lVar19 = lVar45 + lVar44 * 4;
                lVar42 = lVar6 + lVar29 + 2 + lVar44;
                lVar46 = lVar6 + 2 + lVar44;
                lVar44 = lVar44 << 0x20;
                lVar39 = 0;
                while (*(char *)(lVar46 + lVar39) == '\0') {
                  if (*(char *)(lVar42 + lVar39) == '\0') {
                    uVar11 = (ulong)(uint)((int)lVar37 + (int)lVar39);
                    goto LAB_0016436f;
                  }
                  if (*(char *)(lVar46 + 1 + lVar39) != '\0') {
                    uVar36 = lVar37 + lVar39;
                    if (*(char *)(lVar39 + -1 + lVar42) == '\0') {
                      puVar4[RemSP::length_] = RemSP::length_;
                      uVar35 = RemSP::length_;
                      RemSP::length_ = RemSP::length_ + 1;
                    }
                    else {
                      uVar35 = *(uint *)(lVar19 + lVar39 * 4);
                    }
                    uVar11 = uVar36 & 0xffffffff;
                    goto LAB_0016439a;
                  }
                  if (*(char *)(lVar42 + -1 + lVar39) == '\0') {
                    puVar4[RemSP::length_] = RemSP::length_;
                    uVar35 = RemSP::length_;
                    RemSP::length_ = RemSP::length_ + 1;
                  }
                  else {
                    uVar35 = *(uint *)(lVar19 + lVar39 * 4);
                  }
                  *(uint *)(lVar19 + 8 + lVar39 * 4) = uVar35;
                  lVar44 = lVar44 + 0x200000000;
                  lVar7 = lVar37 + lVar39;
                  lVar39 = lVar39 + 2;
                  if (lVar31 <= lVar7 + 2) {
                    uVar35 = iVar14 + (int)lVar39 + 2;
                    iVar14 = iVar14 + (int)lVar39;
                    goto LAB_00164550;
                  }
                }
                if (*(char *)(lVar43 + 1 + (lVar44 >> 0x20)) != '\0') goto code_r0x00164492;
                uVar11 = lVar37 + lVar39 & 0xffffffff;
LAB_001644cd:
                cVar1 = *(char *)(lVar6 + 1 + (long)(int)uVar11);
                puVar4[RemSP::length_] = RemSP::length_;
                uVar35 = RemSP::length_ + 1;
                *(uint *)(lVar45 + (long)(int)uVar11 * 4) = RemSP::length_;
                RemSP::length_ = uVar35;
                if (cVar1 != '\0') break;
              } while( true );
            }
            goto LAB_001643be;
          }
          goto LAB_0016436f;
        }
        if (local_a8 < (int)uVar11) {
          if ((*(char *)(lVar6 + uVar11) == '\0') && (*(char *)(lVar43 + uVar11) == '\0')) {
            *(undefined4 *)(lVar45 + 8 + lVar37 * 4) = 0;
          }
          else {
            *(undefined4 *)(lVar45 + 8 + lVar37 * 4) = *(undefined4 *)(lVar45 + lVar37 * 4);
          }
        }
        else {
          if ((*(char *)(lVar6 + uVar11) == '\0') && (*(char *)(lVar43 + uVar11) == '\0'))
          goto LAB_001646dc;
LAB_001646d0:
          *(undefined4 *)(lVar45 + (long)(int)uVar11 * 4) =
               *(undefined4 *)(lVar45 + -8 + (long)(int)uVar11 * 4);
        }
        goto LAB_00164707;
      }
      *(undefined4 *)(lVar45 + (long)iVar14 * 4) = 0;
      uVar11 = (ulong)(iVar14 + 2U);
    } while ((int)(iVar14 + 2U) < local_a8);
  }
  uVar35 = (uint)uVar11;
  lVar31 = (long)(int)uVar35;
  if (local_a8 < (int)uVar35) {
    if ((*(char *)(lVar6 + lVar31) == '\0') && (*(char *)(lVar43 + lVar31) == '\0')) {
LAB_00164572:
      *(undefined4 *)(lVar45 + lVar31 * 4) = 0;
    }
    else {
LAB_00164606:
      puVar4[RemSP::length_] = RemSP::length_;
      uVar35 = RemSP::length_ + 1;
      *(uint *)(lVar45 + lVar31 * 4) = RemSP::length_;
      RemSP::length_ = uVar35;
    }
  }
  else if ((*(char *)(lVar6 + lVar31) == '\0') && (*(char *)(lVar43 + lVar31) == '\0')) {
LAB_001646dc:
    lVar31 = (long)(int)uVar11;
    if ((*(char *)(lVar31 + 1 + lVar6) == '\0') && (*(char *)(lVar43 + 1 + lVar31) == '\0')) {
      *(undefined4 *)(lVar45 + lVar31 * 4) = 0;
    }
    else {
      puVar4[RemSP::length_] = RemSP::length_;
      uVar35 = RemSP::length_ + 1;
      *(uint *)(lVar45 + lVar31 * 4) = RemSP::length_;
      RemSP::length_ = uVar35;
    }
  }
  else {
LAB_001645c7:
    puVar4[RemSP::length_] = RemSP::length_;
    uVar5 = RemSP::length_ + 1;
    *(uint *)(lVar45 + (long)(int)uVar35 * 4) = RemSP::length_;
    RemSP::length_ = uVar5;
  }
LAB_00164707:
  if (2 < *(int *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74) {
    lVar6 = (long)local_a8;
    lVar29 = 2;
    lVar31 = 1;
    lVar45 = 3;
    lVar43 = 0;
    do {
      pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
      pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
      lVar42 = *(long *)&pMVar2->field_0x10;
      lVar46 = **(long **)&pMVar2->field_0x48;
      lVar33 = lVar46 * lVar29;
      lVar37 = lVar42 + lVar33;
      lVar27 = lVar37 - lVar46;
      lVar19 = lVar37 + lVar46;
      lVar39 = *(long *)&pMVar3->field_0x10;
      lVar44 = **(long **)&pMVar3->field_0x48;
      lVar7 = lVar44 * lVar29;
      lVar40 = lVar39 + lVar7;
      lVar24 = lVar40 + lVar44 * -2;
      cVar1 = *(char *)(lVar42 + lVar33);
      if (2 < (int)uVar26) {
        lVar20 = lVar27 - lVar46;
        local_b0 = 0;
        uVar11 = 0;
        if (cVar1 == '\0') goto LAB_00164885;
LAB_001647e5:
        local_b0 = uVar11;
        lVar21 = (long)(int)local_b0;
        if (*(char *)(lVar21 + 1 + lVar27) == '\0') {
          if (*(char *)(lVar37 + 1 + lVar21) != '\0') goto LAB_00164907;
          if (*(char *)(lVar27 + lVar21) == '\0') {
            RemSP::P_[RemSP::length_] = RemSP::length_;
            uVar35 = RemSP::length_ + 1;
            *(uint *)(lVar40 + lVar21 * 4) = RemSP::length_;
            RemSP::length_ = uVar35;
            goto LAB_00164dc9;
          }
          *(undefined4 *)(lVar40 + lVar21 * 4) = *(undefined4 *)(lVar24 + lVar21 * 4);
          goto LAB_00165647;
        }
        *(undefined4 *)(lVar40 + lVar21 * 4) = *(undefined4 *)(lVar24 + lVar21 * 4);
LAB_00166bb5:
        iVar14 = (int)local_b0;
        uVar35 = iVar14 + 2;
        if ((int)uVar35 < local_a8) {
          lVar15 = (long)iVar14;
          lVar21 = lVar15 + 2;
          lVar38 = lVar46 * lVar45 + lVar15;
          lVar34 = lVar46 * lVar31 + lVar15;
          lVar32 = lVar7 + lVar15 * 4;
          lVar9 = lVar44 * lVar43 + lVar15 * 4;
          lVar16 = lVar15 << 0x20;
          lVar8 = lVar42 + lVar33 + lVar15;
          lVar23 = lVar42 + 2 + lVar34;
          lVar22 = lVar32 + lVar39 + 8;
          lVar41 = lVar39 + lVar9 + 8;
          lVar10 = 0;
          do {
            lVar17 = lVar16 >> 0x1e;
            lVar18 = lVar16 >> 0x20;
            if (*(char *)(lVar8 + 2 + lVar10) == '\0') {
              local_b0 = lVar21 + lVar10;
              if (*(char *)(lVar10 + 2 + lVar38 + lVar42) == '\0') goto LAB_001648df;
              lVar21 = lVar16 + 0x300000000 >> 0x20;
              lVar8 = lVar16 + 0x100000000 >> 0x20;
              if (*(char *)(lVar37 + lVar21) != '\0') {
                if (*(char *)(lVar37 + lVar8) != '\0') goto LAB_00166f23;
                uVar11 = local_b0;
                if (*(char *)(lVar19 + lVar8) == '\0') goto LAB_001648f0;
                if (*(char *)(lVar27 + lVar21) != '\0') goto LAB_00166f34;
                if (*(char *)(lVar27 + 4 + lVar18) != '\0') goto LAB_001664ac;
                if (*(char *)(lVar10 + 2 + lVar34 + lVar42) == '\0') {
                  *(undefined4 *)(lVar22 + lVar10 * 4) = *(undefined4 *)(lVar40 + lVar18 * 4);
                  goto LAB_00165781;
                }
                *(undefined4 *)(lVar22 + lVar10 * 4) =
                     *(undefined4 *)(lVar9 + lVar39 + 8 + lVar10 * 4);
                goto LAB_00164950;
              }
              if (*(char *)(lVar19 + lVar8) != '\0') {
                *(undefined4 *)(lVar32 + lVar39 + 8 + lVar10 * 4) = *(undefined4 *)(lVar40 + lVar17)
                ;
                goto LAB_00165102;
              }
              if (*(char *)(lVar37 + lVar8) == '\0') {
                RemSP::P_[RemSP::length_] = RemSP::length_;
                uVar35 = RemSP::length_ + 1;
                *(uint *)(lVar32 + lVar39 + 8 + lVar10 * 4) = RemSP::length_;
                RemSP::length_ = uVar35;
                goto LAB_00165102;
              }
              *(undefined4 *)(lVar32 + lVar39 + 8 + lVar10 * 4) = *(undefined4 *)(lVar40 + lVar17);
              goto LAB_00165102;
            }
            iVar28 = (int)lVar21;
            if ((*(char *)(lVar8 + 1 + lVar10) != '\0') ||
               (*(char *)(lVar42 + lVar38 + 1 + lVar10) != '\0')) {
              local_b0 = (ulong)(uint)(iVar28 + (int)lVar10);
              goto LAB_00166458;
            }
            if (*(char *)(lVar23 + 1 + lVar10) == '\0') {
              local_b0 = lVar21 + lVar10;
              if (*(char *)(lVar10 + 3 + lVar33 + lVar15 + lVar42) == '\0') {
                if (*(char *)(lVar10 + 2 + lVar34 + lVar42) == '\0') {
                  *(undefined4 *)(lVar32 + lVar39 + 8 + lVar10 * 4) =
                       *(undefined4 *)(lVar24 + lVar17);
                  local_b0 = local_b0 & 0xffffffff;
                  goto LAB_00164dc9;
                }
                *(undefined4 *)(lVar22 + lVar10 * 4) = *(undefined4 *)(lVar41 + lVar10 * 4);
                local_b0 = local_b0 & 0xffffffff;
                goto LAB_00165647;
              }
              cVar1 = *(char *)(lVar10 + 2 + lVar34 + lVar42);
              if (*(char *)(lVar27 + 4 + lVar18) == '\0') {
                if (cVar1 == '\0') {
                  *(undefined4 *)(lVar22 + lVar10 * 4) = *(undefined4 *)(lVar24 + lVar18 * 4);
                  goto LAB_00165781;
                }
                *(undefined4 *)(lVar22 + lVar10 * 4) =
                     *(undefined4 *)(lVar9 + lVar39 + 8 + lVar10 * 4);
                goto LAB_00164950;
              }
              if (cVar1 == '\0') goto LAB_0016722f;
LAB_00164924:
              lVar21 = (long)(int)local_b0;
              if (*(char *)(lVar20 + 1 + lVar21) == '\0') {
                uVar35 = *(uint *)(lVar24 + lVar21 * 4);
                uVar5 = *(uint *)(lVar24 + 8 + lVar21 * 4);
                goto LAB_0016680c;
              }
LAB_00164937:
              uVar35 = *(uint *)(lVar24 + 8 + lVar21 * 4);
LAB_00166842:
              *(uint *)(lVar40 + lVar21 * 4) = uVar35;
LAB_001659f1:
              iVar14 = (int)local_b0;
              uVar35 = iVar14 + 2;
              if ((int)uVar35 < local_a8) {
                lVar16 = (long)iVar14;
                lVar10 = lVar16 << 0x20;
                lVar21 = lVar42 + lVar33 + lVar16;
                lVar23 = lVar21 + 3;
                lVar8 = lVar46 * lVar31 + lVar16 + lVar42;
                lVar32 = lVar39 + lVar44 * lVar43 + lVar16 * 4;
                lVar34 = lVar32 + 8;
                lVar9 = lVar7 + lVar16 * 4;
                lVar15 = lVar39 + lVar9 + 8;
                lVar22 = 0;
                while( true ) {
                  lVar38 = lVar10 >> 0x1e;
                  iVar28 = (int)(lVar16 + 2);
                  iVar13 = (int)lVar22;
                  if (*(char *)(lVar21 + 2 + lVar22) == '\0') {
                    if (*(char *)(lVar46 * lVar45 + lVar16 + lVar42 + 2 + lVar22) == '\0') {
                      local_b0 = lVar16 + 2 + lVar22;
                      lVar21 = lVar10 + 0x300000000 >> 0x20;
                      if (*(char *)(lVar37 + lVar21) == '\0') {
                        local_b0 = local_b0 & 0xffffffff;
                        goto LAB_00164b64;
                      }
                      if (*(char *)(lVar27 + lVar21) != '\0') {
                        *(undefined4 *)(lVar15 + lVar22 * 4) = *(undefined4 *)(lVar34 + lVar22 * 4);
                        goto LAB_001663cb;
                      }
                      if (*(char *)(lVar27 + 4 + (lVar10 >> 0x20)) == '\0') {
                        *(undefined4 *)(lVar15 + lVar22 * 4) = *(undefined4 *)(lVar34 + lVar22 * 4);
                        local_b0 = local_b0 & 0xffffffff;
                        goto LAB_00164950;
                      }
                      local_b0 = local_b0 & 0xffffffff;
                      goto LAB_00164924;
                    }
                    if (*(char *)(lVar23 + lVar22) == '\0') {
                      *(undefined4 *)(lVar9 + lVar39 + 8 + lVar22 * 4) =
                           *(undefined4 *)(lVar40 + lVar38);
                      local_b0 = (ulong)(uint)(iVar28 + iVar13);
                      goto LAB_00165102;
                    }
                    if (*(char *)(lVar8 + 3 + lVar22) != '\0') {
                      local_b0 = (ulong)(uint)(iVar28 + iVar13);
                      *(undefined4 *)(lVar15 + lVar22 * 4) = *(undefined4 *)(lVar34 + lVar22 * 4);
                      goto LAB_001663cb;
                    }
                  }
                  else {
                    if (*(char *)(lVar8 + 3 + lVar22) != '\0') {
                      local_b0 = (ulong)(uint)(iVar28 + iVar13);
                      *(undefined4 *)(lVar15 + lVar22 * 4) = *(undefined4 *)(lVar34 + lVar22 * 4);
                      goto LAB_00166bb5;
                    }
                    if (*(char *)(lVar23 + lVar22) == '\0') {
                      *(undefined4 *)(lVar9 + lVar39 + 8 + lVar22 * 4) =
                           *(undefined4 *)(lVar40 + lVar38);
                      local_b0 = (ulong)(uint)(iVar28 + iVar13);
                      goto LAB_00166537;
                    }
                  }
                  if (*(char *)(lVar8 + 4 + lVar22) == '\0') break;
                  uVar35 = *(uint *)(lVar32 + 0x10 + lVar22 * 4);
                  if (*(char *)(lVar46 * lVar43 + lVar16 + lVar42 + 3 + lVar22) == '\0') {
                    uVar35 = RemSP::Merge(uVar35,*(uint *)(lVar39 + lVar9 + lVar22 * 4));
                  }
                  *(uint *)(lVar15 + lVar22 * 4) = uVar35;
                  lVar10 = lVar10 + 0x200000000;
                  lVar38 = lVar22 + lVar16;
                  lVar22 = lVar22 + 2;
                  if (lVar6 <= lVar38 + 4) {
                    iVar14 = iVar14 + (int)lVar22;
                    uVar35 = iVar28 + (int)lVar22;
                    goto LAB_00165c07;
                  }
                }
                *(undefined4 *)(lVar9 + lVar39 + 8 + lVar22 * 4) = *(undefined4 *)(lVar40 + lVar38);
                local_b0 = (ulong)(uint)(iVar28 + iVar13);
LAB_00165df1:
                iVar14 = (int)local_b0;
                uVar35 = iVar14 + 2;
                if ((int)uVar35 < local_a8) {
                  lVar8 = (long)iVar14;
                  lVar21 = lVar8 + 2;
                  lVar9 = lVar8 << 0x20;
                  lVar32 = lVar7 + lVar8 * 4;
                  lVar23 = lVar39 + lVar32 + 8;
                  lVar10 = lVar33 + lVar8 + lVar42;
                  lVar15 = lVar10 + 3;
                  lVar16 = lVar46 * lVar31 + lVar8 + lVar42;
                  lVar22 = 0;
                  do {
                    lVar38 = lVar9 >> 0x20;
                    lVar34 = lVar9 >> 0x1e;
                    iVar13 = (int)lVar22;
                    iVar28 = (int)lVar21;
                    if (*(char *)(lVar10 + 2 + lVar22) == '\0') {
                      if (*(char *)(lVar42 + lVar46 * lVar45 + lVar8 + 2 + lVar22) == '\0') {
                        local_b0 = (ulong)(uint)(iVar28 + iVar13);
                        goto LAB_0016597b;
                      }
                      if (*(char *)(lVar15 + lVar22) == '\0') {
                        *(undefined4 *)(lVar32 + lVar39 + 8 + lVar22 * 4) =
                             *(undefined4 *)(lVar40 + lVar34);
                        local_b0 = (ulong)(uint)(iVar28 + iVar13);
                        goto LAB_00165102;
                      }
                      if (*(char *)(lVar16 + 3 + lVar22) != '\0') {
                        local_b0 = lVar21 + lVar22;
                        if (*(char *)(lVar22 + 2 + lVar46 * lVar43 + lVar8 + lVar42) == '\0') {
                          uVar35 = RemSP::Merge(*(uint *)(lVar44 * lVar43 + lVar8 * 4 + lVar39 + 8 +
                                                         lVar22 * 4),*(uint *)(lVar40 + lVar34));
                          *(uint *)(lVar23 + lVar22 * 4) = uVar35;
                          goto LAB_001663cb;
                        }
                        if (*(char *)(lVar27 + lVar38) != '\0') goto LAB_001661bd;
                        uVar35 = RemSP::Merge(*(uint *)(lVar44 * lVar43 + lVar8 * 4 + lVar39 + 8 +
                                                       lVar22 * 4),*(uint *)(lVar40 + lVar38 * 4));
                        *(uint *)(lVar23 + lVar22 * 4) = uVar35;
                        goto LAB_001663cb;
                      }
                    }
                    else {
                      if (*(char *)(lVar16 + 3 + lVar22) != '\0') {
                        local_b0 = lVar21 + lVar22;
                        if (*(char *)(lVar22 + 2 + lVar46 * lVar43 + lVar8 + lVar42) == '\0') {
                          uVar35 = RemSP::Merge(*(uint *)(lVar44 * lVar43 + lVar8 * 4 + lVar39 + 8 +
                                                         lVar22 * 4),*(uint *)(lVar40 + lVar34));
                          *(uint *)(lVar23 + lVar22 * 4) = uVar35;
                        }
                        else {
                          if (*(char *)(lVar27 + lVar38) != '\0') goto LAB_00166079;
                          uVar35 = RemSP::Merge(*(uint *)(lVar44 * lVar43 + lVar8 * 4 + lVar39 + 8 +
                                                         lVar22 * 4),*(uint *)(lVar40 + lVar38 * 4))
                          ;
                          *(uint *)(lVar23 + lVar22 * 4) = uVar35;
                        }
                        goto LAB_00166bb5;
                      }
                      if (*(char *)(lVar15 + lVar22) == '\0') goto LAB_0016609a;
                    }
                    if (*(char *)(lVar16 + 4 + lVar22) != '\0') {
                      local_b0 = lVar21 + lVar22;
                      if (*(char *)(lVar20 + 3 + lVar38) == '\0') {
                        uVar35 = RemSP::Merge(*(uint *)(lVar44 * lVar43 + lVar8 * 4 + lVar39 + 0x10
                                                       + lVar22 * 4),*(uint *)(lVar40 + lVar38 * 4))
                        ;
                      }
                      else {
                        if ((*(char *)(lVar22 + 2 + lVar46 * lVar43 + lVar8 + lVar42) != '\0') &&
                           (*(char *)(lVar27 + lVar38) != '\0')) goto LAB_00165fe5;
                        uVar35 = RemSP::Merge(*(uint *)(lVar44 * lVar43 + lVar8 * 4 + lVar39 + 0x10
                                                       + lVar22 * 4),*(uint *)(lVar40 + lVar38 * 4))
                        ;
                      }
                      *(uint *)(lVar23 + lVar22 * 4) = uVar35;
                      local_b0 = local_b0 & 0xffffffff;
                      goto LAB_001659f1;
                    }
                    *(undefined4 *)(lVar23 + lVar22 * 4) =
                         *(undefined4 *)(lVar39 + lVar32 + lVar22 * 4);
                    lVar9 = lVar9 + 0x200000000;
                    lVar34 = lVar21 + lVar22;
                    lVar22 = lVar22 + 2;
                    if (lVar6 <= lVar34 + 2) {
                      iVar14 = iVar14 + (int)lVar22;
                      uVar35 = iVar28 + (int)lVar22;
                      break;
                    }
                  } while( true );
                }
                uVar11 = (ulong)uVar35;
                if (local_a8 < (int)uVar35) goto LAB_00166406;
                lVar42 = (long)iVar14;
                if (*(char *)(lVar37 + uVar11) == '\0') {
                  local_b0 = uVar11;
                  if (*(char *)(lVar19 + uVar11) == '\0') {
LAB_0016600d:
                    uVar35 = (uint)local_b0;
                    local_b0 = (ulong)(int)uVar35;
                    if (*(char *)(local_b0 + 1 + lVar37) == '\0') goto LAB_00166e2c;
                    cVar1 = *(char *)(lVar27 + 1 + local_b0);
                    goto joined_r0x0016602a;
                  }
                  if (*(char *)(lVar37 + 3 + lVar42) != '\0') goto LAB_00165f4f;
                }
                else {
LAB_00165f4f:
                  if (*(char *)(lVar27 + 3 + lVar42) != '\0') {
                    local_b0 = uVar11;
                    if (*(char *)(lVar20 + uVar11) == '\0') {
                      uVar35 = *(uint *)(lVar24 + uVar11 * 4);
                      uVar5 = *(uint *)(lVar40 + lVar42 * 4);
                    }
                    else {
LAB_00166729:
                      uVar11 = (ulong)(int)local_b0;
                      if (*(char *)((uVar11 - 2) + lVar27) == '\0') {
                        uVar35 = *(uint *)(lVar24 + uVar11 * 4);
                      }
                      else {
LAB_00166733:
                        uVar11 = (ulong)(int)local_b0;
                        uVar35 = *(uint *)(lVar24 + uVar11 * 4);
                        if (*(char *)(lVar20 + -1 + uVar11) != '\0') {
                          *(uint *)(lVar40 + uVar11 * 4) = uVar35;
                          goto LAB_00166e66;
                        }
                      }
                      uVar5 = *(uint *)(lVar40 + -8 + uVar11 * 4);
                    }
LAB_00166762:
                    uVar35 = RemSP::Merge(uVar35,uVar5);
                    *(uint *)(lVar40 + uVar11 * 4) = uVar35;
                    goto LAB_00166e66;
                  }
                }
                uVar12 = *(undefined4 *)(lVar40 + lVar42 * 4);
                goto LAB_00166d7b;
              }
LAB_00165c07:
              local_b0 = (ulong)uVar35;
              uVar11 = local_b0;
              if (local_a8 < (int)uVar35) {
LAB_00166406:
                local_b0 = (ulong)(int)uVar11;
                if (*(char *)(lVar37 + local_b0) != '\0') goto LAB_00166d84;
LAB_00166413:
                local_b0 = (ulong)(int)uVar11;
                if (*(char *)(lVar19 + local_b0) != '\0') goto LAB_00166d84;
                goto LAB_00166e59;
              }
              lVar42 = (long)iVar14;
              if (*(char *)(lVar37 + local_b0) == '\0') {
                cVar1 = *(char *)(lVar37 + 3 + lVar42);
                if (*(char *)(lVar19 + local_b0) == '\0') {
                  if (cVar1 != '\0') goto LAB_0016481e;
                  goto LAB_00166e2c;
                }
                if (cVar1 == '\0') goto LAB_00166e98;
              }
              if (*(char *)(lVar27 + 3 + lVar42) != '\0') goto LAB_0016481e;
              goto LAB_00166e98;
            }
            if (*(char *)(lVar23 + lVar10) == '\0') goto LAB_00166fc7;
            *(undefined4 *)(lVar22 + lVar10 * 4) = *(undefined4 *)(lVar41 + lVar10 * 4);
            lVar16 = lVar16 + 0x200000000;
            lVar17 = lVar21 + lVar10;
            lVar10 = lVar10 + 2;
            if (lVar6 <= lVar17 + 2) {
              iVar14 = iVar14 + (int)lVar10;
              uVar35 = iVar28 + (int)lVar10;
              break;
            }
          } while( true );
        }
        local_b0 = (ulong)uVar35;
        if (local_a8 < (int)uVar35) {
          if (*(char *)(lVar37 + local_b0) == '\0') {
            if (*(char *)(lVar19 + local_b0) == '\0') goto LAB_00166e59;
LAB_00166e85:
            if ((*(char *)(lVar19 + (ulong)(iVar14 + 1)) != '\0') ||
               (*(char *)(lVar37 + (ulong)(iVar14 + 1)) != '\0')) goto LAB_00166e95;
            goto LAB_00166e36;
          }
          if ((*(char *)(lVar37 + (ulong)(iVar14 + 1)) == '\0') &&
             (*(char *)(lVar19 + (ulong)(iVar14 + 1)) == '\0')) {
LAB_00167120:
            if (*(char *)(lVar27 + local_b0) == '\0') {
              uVar12 = *(undefined4 *)(lVar24 + (long)iVar14 * 4);
              goto LAB_00166d89;
            }
            goto LAB_0016481e;
          }
LAB_00166e95:
          lVar42 = (long)iVar14;
LAB_00166e98:
          uVar12 = *(undefined4 *)(lVar40 + lVar42 * 4);
          goto LAB_00166d89;
        }
        if (*(char *)(lVar37 + local_b0) == '\0') {
          uVar30 = local_b0;
          if (*(char *)(lVar19 + local_b0) == '\0') goto LAB_00166e18;
          if (*(char *)(lVar37 + (ulong)(iVar14 + 3)) == '\0') goto LAB_00166e85;
          if (*(char *)(lVar37 + (ulong)(iVar14 + 1)) != '\0') goto LAB_00166d64;
          if (*(char *)(lVar19 + (ulong)(iVar14 + 1)) != '\0') {
            if (*(char *)(lVar27 + (ulong)(iVar14 + 3)) == '\0') {
              if (*(char *)(lVar27 + local_b0) == '\0') goto LAB_00166e95;
              goto LAB_0016481e;
            }
            goto LAB_00166d6e;
          }
          goto LAB_001647ae;
        }
        if ((*(char *)(lVar37 + (ulong)(iVar14 + 1)) == '\0') &&
           (*(char *)(lVar19 + (ulong)(iVar14 + 1)) == '\0')) {
          if (*(char *)(lVar27 + 3 + (long)iVar14) == '\0') goto LAB_00167120;
          if (*(char *)(lVar27 + local_b0) != '\0') goto LAB_0016481e;
LAB_00167106:
          uVar11 = (ulong)(int)uVar35;
          if (*(char *)(lVar20 + uVar11) != '\0') goto LAB_00166d77;
          uVar5 = *(uint *)(lVar24 + -8 + uVar11 * 4);
          uVar35 = *(uint *)(lVar24 + uVar11 * 4);
LAB_00165333:
          uVar35 = RemSP::Merge(uVar5,uVar35);
          *(uint *)(lVar40 + uVar11 * 4) = uVar35;
        }
        else {
LAB_00166d64:
          uVar35 = (uint)local_b0;
          local_b0 = (ulong)(int)uVar35;
          if (*(char *)(lVar27 + 1 + local_b0) == '\0') {
LAB_00166d84:
            uVar12 = *(undefined4 *)(lVar40 + -8 + local_b0 * 4);
            goto LAB_00166d89;
          }
LAB_00166d6e:
          uVar11 = (ulong)(int)uVar35;
          if (*(char *)(lVar27 + uVar11) == '\0') {
            uVar5 = *(uint *)(lVar24 + uVar11 * 4);
            if (*(char *)(lVar20 + uVar11) == '\0') {
LAB_0016532e:
              uVar35 = *(uint *)(lVar40 + -8 + uVar11 * 4);
              goto LAB_00165333;
            }
            *(uint *)(lVar40 + uVar11 * 4) = uVar5;
          }
          else {
LAB_00166d77:
            uVar12 = *(undefined4 *)(lVar24 + uVar11 * 4);
LAB_00166d7b:
            *(undefined4 *)(lVar40 + uVar11 * 4) = uVar12;
          }
        }
        goto LAB_00166e66;
      }
      if (uVar26 == 2) {
        uVar30 = 0;
        uVar35 = 0;
        if (cVar1 == '\0') {
LAB_00164c5a:
          uVar35 = (uint)uVar30;
          local_b0 = (ulong)(int)uVar35;
          if (*(char *)(lVar19 + local_b0) == '\0') {
LAB_00166e18:
            local_b0 = uVar30 & 0xffffffff;
LAB_00166e1b:
            uVar35 = (uint)local_b0;
            if (*(char *)(lVar37 + 1 + (long)(int)uVar35) != '\0') goto LAB_001647ae;
LAB_00166e2c:
            local_b0 = (ulong)(int)uVar35;
            if (*(char *)(lVar19 + 1 + local_b0) == '\0') goto LAB_00166e59;
          }
          else if (*(char *)(lVar37 + 1 + local_b0) != '\0') goto LAB_001647ae;
LAB_00166e36:
          RemSP::P_[RemSP::length_] = RemSP::length_;
          uVar35 = RemSP::length_ + 1;
          *(uint *)(lVar40 + local_b0 * 4) = RemSP::length_;
          RemSP::length_ = uVar35;
        }
        else {
LAB_001647ae:
          local_b0 = (ulong)(int)uVar35;
          uVar36 = (ulong)uVar35;
          if (*(char *)(lVar27 + 1 + local_b0) == '\0') goto LAB_00164811;
LAB_0016481e:
          uVar12 = *(undefined4 *)(lVar24 + local_b0 * 4);
LAB_00166d89:
          *(undefined4 *)(lVar40 + local_b0 * 4) = uVar12;
        }
      }
      else {
        uVar30 = 0;
        uVar36 = 0;
        if (cVar1 != '\0') {
LAB_00164811:
          local_b0 = (ulong)(int)uVar36;
          cVar1 = *(char *)(lVar27 + local_b0);
joined_r0x0016602a:
          if (cVar1 == '\0') goto LAB_00166e36;
          goto LAB_0016481e;
        }
LAB_00164c09:
        local_b0 = (ulong)(int)uVar30;
        if (*(char *)(lVar19 + local_b0) != '\0') goto LAB_00166e36;
LAB_00166e59:
        *(undefined4 *)(lVar40 + local_b0 * 4) = 0;
      }
LAB_00166e66:
      lVar29 = lVar29 + 2;
      lVar31 = lVar31 + 2;
      lVar43 = lVar43 + 2;
      lVar45 = lVar45 + 2;
    } while ((int)lVar29 < *(int *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74);
  }
  if (this->o_rows == false) {
    return;
  }
  pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  lVar43 = *(long *)&pMVar2->field_0x10;
  lVar29 = **(long **)&pMVar2->field_0x48;
  lVar19 = (long)(int)(uVar25 - 1);
  lVar6 = lVar43 + lVar29 * lVar19;
  lVar46 = lVar6 - lVar29;
  lVar45 = *(long *)&pMVar3->field_0x10;
  lVar37 = **(long **)&pMVar3->field_0x48;
  lVar31 = lVar45 + lVar37 * lVar19;
  lVar42 = lVar31 + lVar37 * -2;
  uVar11 = 0;
  if (2 < (int)uVar26) {
    lVar27 = lVar46 - lVar29;
    lVar33 = (long)local_a8;
    lVar7 = lVar37 * lVar19 + lVar45 + 8;
    lVar24 = (lVar19 + -1) * lVar29;
    lVar40 = lVar24 + lVar43 + 4;
    lVar44 = lVar29 * lVar19 + lVar43 + 3;
    lVar39 = lVar29 * (lVar19 + -2) + lVar43 + 3;
    lVar29 = lVar37 * (lVar19 + -2) + lVar45 + 0x10;
    iVar14 = -2;
    uVar11 = 0;
    do {
      lVar45 = (long)(int)uVar11;
      uVar36 = uVar11;
      if (*(char *)(lVar6 + lVar45) == '\0') goto LAB_00167552;
      if (*(char *)((long)iVar14 + 3 + lVar46) != '\0') {
        *(undefined4 *)(lVar31 + lVar45 * 4) = *(undefined4 *)(lVar42 + lVar45 * 4);
        goto LAB_00167cc7;
      }
      if (*(char *)(lVar6 + 3 + (long)iVar14) != '\0') {
LAB_0016756c:
        uVar11 = (ulong)(int)uVar36;
        if (*(char *)(lVar46 + 2 + uVar11) != '\0') {
          if (*(char *)(lVar46 + uVar11) != '\0') goto LAB_00167583;
          goto LAB_001678b3;
        }
        if (*(char *)(lVar46 + uVar11) == '\0') goto LAB_001678be;
LAB_001675ae:
        *(undefined4 *)(lVar31 + uVar11 * 4) = *(undefined4 *)(lVar42 + uVar11 * 4);
        lVar45 = (long)(int)uVar36;
        uVar11 = lVar45 + 2;
        uVar25 = (uint)uVar11;
        if ((int)uVar25 < local_a8) {
          uVar36 = uVar11;
          if (*(char *)(lVar6 + uVar11) == '\0') goto LAB_00167868;
          if (*(char *)(lVar45 + 3 + lVar46) != '\0') {
            if (*(char *)(lVar27 + uVar11) == '\0') {
              uVar25 = RemSP::Merge(*(uint *)(lVar42 + 8 + lVar45 * 4),
                                    *(uint *)(lVar31 + lVar45 * 4));
              *(uint *)(lVar31 + 8 + lVar45 * 4) = uVar25;
              goto LAB_00167cc7;
            }
LAB_00167b81:
            lVar45 = (long)(int)uVar11;
            cVar1 = *(char *)(lVar27 + -1 + lVar45);
            goto joined_r0x00167b94;
          }
          if (*(char *)(lVar6 + 3 + lVar45) != '\0') {
            if (*(char *)(lVar45 + 4 + lVar46) == '\0') {
              *(undefined4 *)(lVar31 + 8 + lVar45 * 4) = *(undefined4 *)(lVar31 + lVar45 * 4);
              goto LAB_00167abb;
            }
            if ((*(char *)(lVar27 + 3 + lVar45) == '\0') || (*(char *)(lVar27 + uVar11) == '\0')) {
              uVar25 = RemSP::Merge(*(uint *)(lVar42 + 0x10 + lVar45 * 4),
                                    *(uint *)(lVar31 + lVar45 * 4));
              *(uint *)(lVar31 + 8 + lVar45 * 4) = uVar25;
              goto LAB_001678e0;
            }
LAB_00167bfd:
            lVar45 = (long)(int)uVar11;
            uVar36 = uVar11;
            if (*(char *)(lVar27 + -1 + lVar45) != '\0') goto LAB_0016759c;
            uVar25 = *(uint *)(lVar42 + 8 + lVar45 * 4);
            uVar26 = *(uint *)(lVar31 + -8 + lVar45 * 4);
LAB_0016766f:
            uVar25 = RemSP::Merge(uVar25,uVar26);
            do {
              *(uint *)(lVar31 + lVar45 * 4) = uVar25;
              uVar11 = uVar36;
LAB_001678e0:
              iVar14 = (int)uVar11;
              uVar25 = iVar14 + 2;
              if (local_a8 <= (int)uVar25) {
LAB_0016805d:
                if (local_a8 < (int)uVar25) {
                  uVar11 = (ulong)uVar25;
                  goto LAB_00168065;
                }
                lVar43 = (long)(int)uVar25;
                lVar29 = (long)iVar14;
                if (*(char *)(lVar6 + lVar43) == '\0') {
                  if (*(char *)(lVar6 + 3 + lVar29) != '\0') goto LAB_0016825f;
                  goto LAB_0016826d;
                }
                if (*(char *)(lVar46 + 3 + lVar29) != '\0') goto LAB_0016825f;
LAB_001680cf:
                uVar12 = *(undefined4 *)(lVar31 + lVar29 * 4);
                goto LAB_00168264;
              }
              lVar20 = (long)iVar14;
              lVar21 = lVar20 << 0x20;
              lVar45 = lVar7 + lVar20 * 4;
              lVar37 = lVar40 + lVar20;
              lVar19 = lVar29 + lVar20 * 4;
              lVar32 = 0;
LAB_00167935:
              if (*(char *)(lVar44 + lVar20 + -1 + lVar32) != '\0') {
                iVar28 = (int)lVar32;
                if (*(char *)(lVar37 + -1 + lVar32) != '\0') {
                  uVar11 = (ulong)(iVar14 + iVar28 + 2);
                  *(undefined4 *)(lVar45 + lVar32 * 4) = *(undefined4 *)(lVar19 + -8 + lVar32 * 4);
                  goto LAB_00167cc7;
                }
                if (*(char *)(lVar44 + lVar20 + lVar32) != '\0') goto code_r0x00167959;
                uVar25 = iVar14 + iVar28 + 2;
                *(undefined4 *)(lVar45 + lVar32 * 4) = *(undefined4 *)(lVar31 + (lVar21 >> 0x1e));
LAB_00167bb5:
                uVar11 = (ulong)uVar25;
                goto LAB_00167f3b;
              }
              uVar36 = (uVar11 & 0xffffffff) + lVar32 + 2;
              iVar14 = (int)uVar36;
              lVar45 = lVar21 + 0x300000000 >> 0x20;
              uVar11 = lVar20 + 2 + lVar32;
              if (*(char *)(lVar6 + lVar45) == '\0') goto LAB_001676ae;
              if (*(char *)(lVar46 + lVar45) != '\0') {
LAB_0016787e:
                do {
                  *(undefined4 *)(lVar31 + uVar11 * 4) = *(undefined4 *)(lVar42 + uVar11 * 4);
                  uVar11 = (long)(int)uVar36 + 2;
                  if (local_a8 <= (int)uVar11) {
                    if (local_a8 < (int)uVar11) goto LAB_00168065;
                    if (*(char *)(lVar6 + uVar11) == '\0') goto LAB_00168240;
LAB_00168093:
                    lVar43 = (long)(int)uVar11;
                    if (*(char *)(lVar46 + 1 + lVar43) == '\0') {
                      uVar25 = *(uint *)(lVar31 + -8 + lVar43 * 4);
                      goto LAB_001682fb;
                    }
                    if (*(char *)(lVar46 + lVar43) != '\0') goto LAB_001680ad;
                    uVar25 = *(uint *)(lVar42 + lVar43 * 4);
                    if (*(char *)(lVar27 + lVar43) != '\0') {
                      *(uint *)(lVar31 + lVar43 * 4) = uVar25;
                      return;
                    }
                    uVar26 = *(uint *)(lVar31 + -8 + lVar43 * 4);
                    goto LAB_001682f6;
                  }
                  uVar36 = uVar11;
                  if (*(char *)(lVar6 + uVar11) != '\0') goto LAB_00167d59;
LAB_00167552:
                  iVar14 = (int)uVar36;
                  uVar11 = (ulong)iVar14;
                  if (*(char *)(uVar11 + 1 + lVar6) == '\0') {
                    while( true ) {
                      uVar11 = (ulong)iVar14;
LAB_001676ae:
                      *(undefined4 *)(lVar31 + uVar11 * 4) = 0;
                      lVar45 = (long)iVar14;
                      uVar11 = lVar45 + 2;
                      if (local_a8 <= (int)uVar11) break;
                      uVar36 = uVar11;
                      if (*(char *)(lVar6 + uVar11) == '\0') goto LAB_00167552;
                      if (*(char *)(lVar45 + 3 + lVar46) != '\0') {
                        if ((*(char *)(lVar46 + uVar11) == '\0') &&
                           (*(char *)(lVar46 + 1 + lVar45) != '\0')) goto LAB_00167e21;
                        *(undefined4 *)(lVar31 + 8 + lVar45 * 4) =
                             *(undefined4 *)(lVar42 + 8 + lVar45 * 4);
                        goto LAB_00167cc7;
                      }
                      if (*(char *)(lVar6 + 3 + lVar45) == '\0') {
                        if (*(char *)(lVar46 + uVar11) == '\0') {
                          if (*(char *)(lVar46 + 1 + lVar45) == '\0') {
                            RemSP::P_[RemSP::length_] = RemSP::length_;
                            uVar25 = RemSP::length_ + 1;
                            *(uint *)(lVar31 + 8 + lVar45 * 4) = RemSP::length_;
                            RemSP::length_ = uVar25;
                            goto LAB_00167f3b;
                          }
                          uVar12 = *(undefined4 *)(lVar42 + lVar45 * 4);
                        }
                        else {
                          uVar12 = *(undefined4 *)(lVar42 + 8 + lVar45 * 4);
                        }
                        *(undefined4 *)(lVar31 + 8 + lVar45 * 4) = uVar12;
                        goto LAB_00167f3b;
                      }
                      cVar1 = *(char *)(lVar45 + 2 + lVar46);
                      if (*(char *)(lVar45 + 4 + lVar46) != '\0') {
                        if (cVar1 != '\0') goto LAB_00167583;
                        if (*(char *)(lVar46 + 1 + lVar45) == '\0') {
                          *(undefined4 *)(lVar31 + 8 + lVar45 * 4) =
                               *(undefined4 *)(lVar42 + 0x10 + lVar45 * 4);
                        }
                        else {
LAB_00167deb:
                          lVar45 = (long)(int)uVar11;
                          if ((*(char *)(lVar27 + 1 + lVar45) == '\0') ||
                             (*(char *)(lVar27 + lVar45) == '\0')) {
                            uVar25 = RemSP::Merge(*(uint *)(lVar42 + -8 + lVar45 * 4),
                                                  *(uint *)(lVar42 + 8 + lVar45 * 4));
                          }
                          else {
                            uVar25 = *(uint *)(lVar42 + 8 + lVar45 * 4);
                          }
                          *(uint *)(lVar31 + lVar45 * 4) = uVar25;
                        }
                        goto LAB_001678e0;
                      }
                      if (cVar1 != '\0') goto LAB_001675ae;
                      if (*(char *)(lVar46 + 1 + lVar45) == '\0') {
                        RemSP::P_[RemSP::length_] = RemSP::length_;
                        uVar25 = RemSP::length_;
                        RemSP::length_ = RemSP::length_ + 1;
                      }
                      else {
                        uVar25 = *(uint *)(lVar42 + lVar45 * 4);
                      }
LAB_001677bc:
                      *(uint *)(lVar31 + uVar11 * 4) = uVar25;
                      lVar45 = (long)(int)uVar36;
                      uVar11 = lVar45 + 2;
                      if (local_a8 <= (int)uVar11) {
                        if (local_a8 < (int)uVar11) goto LAB_00168065;
                        if (*(char *)(lVar6 + uVar11) == '\0') goto LAB_001680db;
                        if (*(char *)(lVar46 + 3 + lVar45) != '\0') goto LAB_0016816c;
                        goto LAB_001682d7;
                      }
                      uVar36 = uVar11;
                      if (*(char *)(lVar6 + uVar11) != '\0') {
                        if (*(char *)(lVar45 + 3 + lVar46) != '\0') {
                          uVar25 = RemSP::Merge(*(uint *)(lVar42 + 8 + lVar45 * 4),
                                                *(uint *)(lVar31 + lVar45 * 4));
                          *(uint *)(lVar31 + 8 + lVar45 * 4) = uVar25;
                          goto LAB_00167cc7;
                        }
                        if (*(char *)(lVar6 + 3 + lVar45) == '\0') {
                          *(undefined4 *)(lVar31 + 8 + lVar45 * 4) =
                               *(undefined4 *)(lVar31 + lVar45 * 4);
                          goto LAB_00167f3b;
                        }
                        if (*(char *)(lVar45 + 4 + lVar46) != '\0') {
                          uVar25 = RemSP::Merge(*(uint *)(lVar42 + 0x10 + lVar45 * 4),
                                                *(uint *)(lVar31 + lVar45 * 4));
                          *(uint *)(lVar31 + 8 + lVar45 * 4) = uVar25;
                          goto LAB_001678e0;
                        }
                        *(undefined4 *)(lVar31 + 8 + lVar45 * 4) =
                             *(undefined4 *)(lVar31 + lVar45 * 4);
LAB_00167abb:
                        while( true ) {
                          iVar14 = (int)uVar11;
                          uVar25 = iVar14 + 2;
                          if (local_a8 <= (int)uVar25) break;
                          lVar21 = (long)iVar14;
                          lVar45 = lVar21 + 2;
                          lVar20 = lVar21 << 0x20;
                          lVar37 = lVar7 + lVar21 * 4;
                          lVar19 = lVar40 + lVar21;
                          lVar32 = 0;
                          while( true ) {
                            if (*(char *)(lVar44 + lVar21 + -1 + lVar32) == '\0') {
                              uVar36 = (ulong)(uint)((int)lVar45 + (int)lVar32);
                              goto LAB_00167868;
                            }
                            lVar9 = lVar20 >> 0x20;
                            lVar8 = lVar20 >> 0x1e;
                            if (*(char *)(lVar19 + -1 + lVar32) != '\0') break;
                            if (*(char *)(lVar44 + lVar21 + lVar32) == '\0') {
                              uVar25 = (int)lVar45 + (int)lVar32;
                              *(undefined4 *)(lVar37 + lVar32 * 4) = *(undefined4 *)(lVar31 + lVar8)
                              ;
                              goto LAB_00167bb5;
                            }
                            if (*(char *)(lVar19 + lVar32) != '\0') {
                              if ((*(char *)(lVar32 + lVar39 + lVar21) == '\0') ||
                                 (*(char *)(lVar32 + -1 + lVar39 + lVar21) == '\0')) {
                                uVar25 = *(uint *)(lVar29 + lVar21 * 4 + lVar32 * 4);
                                uVar26 = *(uint *)(lVar31 + lVar8);
                              }
                              else {
                                if (*(char *)(lVar46 + lVar9) != '\0') {
                                  uVar11 = lVar45 + lVar32 & 0xffffffff;
                                  goto LAB_00167bfd;
                                }
                                uVar25 = *(uint *)(lVar29 + lVar21 * 4 + lVar32 * 4);
                                uVar26 = *(uint *)(lVar31 + lVar9 * 4);
                              }
                              uVar25 = RemSP::Merge(uVar25,uVar26);
                              *(uint *)(lVar37 + lVar32 * 4) = uVar25;
                              uVar11 = lVar45 + lVar32 & 0xffffffff;
                              goto LAB_001678e0;
                            }
                            *(undefined4 *)(lVar37 + lVar32 * 4) =
                                 *(undefined4 *)(lVar37 + -8 + lVar32 * 4);
                            lVar20 = lVar20 + 0x200000000;
                            lVar9 = lVar32 + lVar45;
                            lVar32 = lVar32 + 2;
                            if (lVar33 <= lVar9 + 2) {
                              uVar25 = iVar14 + (int)lVar32 + 2;
                              iVar14 = iVar14 + (int)lVar32;
                              goto LAB_00167fa6;
                            }
                          }
                          if (*(char *)(lVar32 + -1 + lVar39 + lVar21) == '\0') {
                            uVar25 = *(uint *)(lVar29 + lVar21 * 4 + -8 + lVar32 * 4);
                            uVar26 = *(uint *)(lVar31 + lVar8);
                          }
                          else {
                            if (*(char *)(lVar46 + lVar9) != '\0') {
                              uVar11 = lVar45 + lVar32 & 0xffffffff;
                              goto LAB_00167b81;
                            }
                            uVar25 = *(uint *)(lVar29 + lVar21 * 4 + -8 + lVar32 * 4);
                            uVar26 = *(uint *)(lVar31 + lVar9 * 4);
                          }
                          uVar25 = RemSP::Merge(uVar25,uVar26);
                          *(uint *)(lVar37 + lVar32 * 4) = uVar25;
                          uVar11 = lVar45 + lVar32 & 0xffffffff;
LAB_00167cc7:
                          iVar14 = (int)uVar11;
                          uVar25 = iVar14 + 2;
                          if (local_a8 <= (int)uVar25) {
LAB_00168011:
                            uVar11 = (ulong)uVar25;
                            lVar43 = (long)(int)uVar25;
                            if (local_a8 < (int)uVar25) {
                              if (*(char *)(lVar6 + lVar43) == '\0') goto LAB_0016826d;
                              lVar29 = (long)iVar14;
                              if (*(char *)(lVar6 + 1 + lVar29) != '\0') goto LAB_001680cf;
                            }
                            else {
                              if (*(char *)(lVar6 + lVar43) == '\0') goto LAB_00168240;
                              if (*(char *)(lVar6 + 1 + (long)iVar14) != '\0') goto LAB_00168093;
                              if (*(char *)(lVar46 + 3 + (long)iVar14) != '\0') {
                                if (*(char *)(lVar46 + lVar43) != '\0') goto LAB_0016825f;
                                goto LAB_001681e4;
                              }
                            }
                            if (*(char *)(lVar46 + lVar43) != '\0') goto LAB_0016825f;
                            uVar12 = *(undefined4 *)(lVar42 + (long)iVar14 * 4);
                            goto LAB_00168264;
                          }
                          lVar20 = (long)iVar14;
                          lVar45 = lVar20 + 2;
                          lVar37 = lVar29 + lVar20 * 4;
                          lVar19 = lVar43 + lVar24 + 2 + lVar20;
                          lVar32 = lVar44 + lVar20;
                          lVar20 = lVar7 + lVar20 * 4;
                          lVar21 = 0;
LAB_00167cff:
                          iVar28 = (int)lVar45;
                          iVar13 = (int)lVar21;
                          if (*(char *)(lVar32 + -1 + lVar21) == '\0') {
                            uVar36 = (ulong)(uint)(iVar28 + iVar13);
                            goto LAB_00167552;
                          }
                          if (*(char *)(lVar32 + -2 + lVar21) == '\0') {
                            if (*(char *)(lVar19 + 1 + lVar21) == '\0') {
                              uVar11 = lVar45 + lVar21;
                              if (*(char *)(lVar21 + lVar32) != '\0') {
                                if (*(char *)(lVar21 + 2 + lVar19) != '\0') {
                                  uVar11 = uVar11 & 0xffffffff;
                                  uVar36 = uVar11;
                                  if (*(char *)(lVar21 + lVar19) == '\0') goto LAB_00167deb;
                                  goto LAB_00167583;
                                }
                                if (*(char *)(lVar21 + lVar19) == '\0') {
                                  uVar36 = uVar11 & 0xffffffff;
                                  uVar25 = *(uint *)(lVar37 + -0x10 + lVar21 * 4);
                                  goto LAB_001677bc;
                                }
                                uVar36 = uVar11 & 0xffffffff;
                                goto LAB_001675ae;
                              }
                              if (*(char *)(lVar21 + lVar19) == '\0') {
                                uVar12 = *(undefined4 *)(lVar37 + -0x10 + lVar21 * 4);
                              }
                              else {
                                uVar12 = *(undefined4 *)(lVar37 + -8 + lVar21 * 4);
                              }
                              *(undefined4 *)(lVar20 + lVar21 * 4) = uVar12;
                              uVar11 = uVar11 & 0xffffffff;
                              goto LAB_00167f3b;
                            }
                            if (*(char *)(lVar19 + lVar21) != '\0') goto code_r0x00167d24;
                            uVar11 = (ulong)(uint)(iVar28 + iVar13);
LAB_00167e21:
                            lVar45 = (long)(int)uVar11;
                            cVar1 = *(char *)(lVar27 + lVar45);
joined_r0x00167b94:
                            if (cVar1 == '\0') {
                              uVar25 = RemSP::Merge(*(uint *)(lVar42 + -8 + lVar45 * 4),
                                                    *(uint *)(lVar42 + lVar45 * 4));
                            }
                            else {
                              uVar25 = *(uint *)(lVar42 + lVar45 * 4);
                            }
                            *(uint *)(lVar31 + lVar45 * 4) = uVar25;
                            goto LAB_00167cc7;
                          }
                          uVar11 = (ulong)(uint)(iVar28 + iVar13);
LAB_00167d59:
                          lVar45 = (long)(int)uVar11;
                          if (*(char *)(lVar45 + 1 + lVar46) != '\0') {
                            if (*(char *)(lVar46 + lVar45) == '\0') {
                              uVar25 = *(uint *)(lVar42 + lVar45 * 4);
                              if (*(char *)(lVar27 + lVar45) != '\0') {
                                *(uint *)(lVar31 + lVar45 * 4) = uVar25;
                                goto LAB_00167cc7;
                              }
                              uVar25 = RemSP::Merge(uVar25,*(uint *)(lVar31 + -8 + lVar45 * 4));
                            }
                            else {
                              uVar25 = *(uint *)(lVar42 + lVar45 * 4);
                            }
                            *(uint *)(lVar31 + lVar45 * 4) = uVar25;
                            goto LAB_00167cc7;
                          }
                          if (*(char *)(lVar6 + 1 + lVar45) == '\0') {
                            *(undefined4 *)(lVar31 + lVar45 * 4) =
                                 *(undefined4 *)(lVar31 + -8 + lVar45 * 4);
                            goto LAB_00167f3b;
                          }
                          if (*(char *)(lVar45 + 2 + lVar46) != '\0') {
                            if (*(char *)(lVar27 + 1 + lVar45) == '\0') {
                              uVar25 = *(uint *)(lVar42 + 8 + lVar45 * 4);
LAB_00167ee6:
                              uVar25 = RemSP::Merge(uVar25,*(uint *)(lVar31 + -8 + lVar45 * 4));
                            }
                            else {
                              if (*(char *)(lVar46 + lVar45) == '\0') {
                                uVar25 = *(uint *)(lVar42 + 8 + lVar45 * 4);
                                if (*(char *)(lVar27 + lVar45) == '\0') goto LAB_00167ee6;
                                *(uint *)(lVar31 + lVar45 * 4) = uVar25;
                                goto LAB_001678e0;
                              }
                              uVar25 = *(uint *)(lVar42 + 8 + lVar45 * 4);
                            }
                            *(uint *)(lVar31 + lVar45 * 4) = uVar25;
                            goto LAB_001678e0;
                          }
                          *(undefined4 *)(lVar31 + lVar45 * 4) =
                               *(undefined4 *)(lVar31 + -8 + lVar45 * 4);
                        }
LAB_00167fa6:
                        uVar11 = (ulong)uVar25;
                        if (local_a8 < (int)uVar25) goto LAB_00168065;
                        lVar43 = (long)(int)uVar25;
                        if (*(char *)(lVar6 + lVar43) == '\0') goto LAB_001680db;
                        lVar6 = (long)iVar14;
                        if (*(char *)(lVar46 + 3 + lVar6) == '\0') {
                          uVar25 = *(uint *)(lVar31 + lVar6 * 4);
                          goto LAB_001682fb;
                        }
                        if ((*(char *)(lVar27 + lVar43) != '\0') &&
                           (*(char *)(lVar46 + lVar6) != '\0')) goto LAB_00167ff5;
                        uVar25 = *(uint *)(lVar42 + lVar43 * 4);
                        uVar26 = *(uint *)(lVar31 + lVar6 * 4);
                        goto LAB_001682f6;
                      }
LAB_00167868:
                      iVar14 = (int)uVar36;
                      uVar11 = (ulong)iVar14;
                      if (*(char *)(uVar11 + 1 + lVar6) != '\0') {
                        if (*(char *)(lVar46 + 1 + uVar11) != '\0') goto LAB_0016787e;
                        uVar11 = (ulong)iVar14;
                        if (*(char *)(uVar11 + 2 + lVar46) != '\0') goto LAB_001678b3;
LAB_001678be:
                        RemSP::P_[RemSP::length_] = RemSP::length_;
                        uVar25 = RemSP::length_;
                        RemSP::length_ = RemSP::length_ + 1;
                        goto LAB_001677bc;
                      }
                    }
                    if (local_a8 < (int)uVar11) {
                      if (*(char *)(lVar6 + uVar11) == '\0') {
                        *(undefined4 *)(lVar31 + 8 + lVar45 * 4) = 0;
                        return;
                      }
LAB_001682ab:
                      if (*(char *)(lVar46 + uVar11) == '\0') {
                        if (*(char *)(lVar46 + 1 + lVar45) == '\0') {
                          RemSP::P_[RemSP::length_] = RemSP::length_;
                          uVar25 = RemSP::length_ + 1;
                          *(uint *)(lVar31 + 8 + lVar45 * 4) = RemSP::length_;
                          RemSP::length_ = uVar25;
                          return;
                        }
                        uVar12 = *(undefined4 *)(lVar42 + lVar45 * 4);
                        goto LAB_001682b7;
                      }
                    }
                    else {
                      if (*(char *)(lVar6 + uVar11) == '\0') goto LAB_00168240;
                      if (*(char *)(lVar46 + 3 + lVar45) == '\0') goto LAB_001682ab;
                      if ((*(char *)(lVar46 + uVar11) == '\0') &&
                         (*(char *)(lVar46 + 1 + lVar45) != '\0')) {
LAB_001681e4:
                        lVar43 = (long)(int)uVar11;
                        cVar1 = *(char *)(lVar27 + lVar43);
                        goto joined_r0x001681f3;
                      }
                    }
                    uVar12 = *(undefined4 *)(lVar42 + 8 + lVar45 * 4);
LAB_001682b7:
                    *(undefined4 *)(lVar31 + 8 + lVar45 * 4) = uVar12;
                    return;
                  }
                } while (*(char *)(lVar46 + 1 + uVar11) != '\0');
                goto LAB_0016756c;
              }
              if (*(char *)(lVar46 + 4 + (lVar21 >> 0x20)) == '\0') goto LAB_001675ae;
LAB_00167583:
              lVar45 = (long)(int)uVar36;
              if (*(char *)(lVar27 + 1 + lVar45) == '\0') goto LAB_00167665;
LAB_0016759c:
              uVar25 = *(uint *)(lVar42 + 8 + lVar45 * 4);
            } while( true );
          }
          *(undefined4 *)(lVar31 + 8 + lVar45 * 4) = *(undefined4 *)(lVar31 + lVar45 * 4);
          goto LAB_00167f3b;
        }
        if ((int)uVar25 <= local_a8) {
          if (*(char *)(lVar6 + uVar11) != '\0') {
            if (*(char *)(lVar46 + 3 + lVar45) == '\0') {
LAB_001682d7:
              uVar25 = *(uint *)(lVar31 + lVar45 * 4);
            }
            else {
              if (*(char *)(lVar27 + uVar11) != '\0') {
LAB_00167ff5:
                lVar43 = (long)(int)uVar25;
                cVar1 = *(char *)(lVar27 + -1 + lVar43);
joined_r0x001681f3:
                if (cVar1 == '\0') {
                  uVar25 = *(uint *)(lVar42 + -8 + lVar43 * 4);
                  uVar26 = *(uint *)(lVar42 + lVar43 * 4);
LAB_001682f6:
                  uVar25 = RemSP::Merge(uVar25,uVar26);
                }
                else {
LAB_001680ad:
                  uVar25 = *(uint *)(lVar42 + lVar43 * 4);
                }
LAB_001682fb:
                *(uint *)(lVar31 + lVar43 * 4) = uVar25;
                return;
              }
LAB_0016816c:
              uVar25 = RemSP::Merge(*(uint *)(lVar42 + 8 + lVar45 * 4),
                                    *(uint *)(lVar31 + lVar45 * 4));
            }
            *(uint *)(lVar31 + 8 + lVar45 * 4) = uVar25;
            return;
          }
LAB_001680db:
          lVar43 = (long)(int)uVar11;
          if (*(char *)(lVar43 + 1 + lVar6) == '\0') goto LAB_0016826d;
          cVar1 = *(char *)(lVar46 + 1 + lVar43);
          goto joined_r0x001680ef;
        }
LAB_00168065:
        lVar43 = (long)(int)uVar11;
        if (*(char *)(lVar6 + lVar43) == '\0') goto LAB_0016826d;
        uVar12 = *(undefined4 *)(lVar31 + -8 + lVar43 * 4);
        goto LAB_00168264;
      }
      if (*(char *)(lVar46 + lVar45) == '\0') {
        RemSP::P_[RemSP::length_] = RemSP::length_;
        uVar25 = RemSP::length_ + 1;
        *(uint *)(lVar31 + lVar45 * 4) = RemSP::length_;
        RemSP::length_ = uVar25;
      }
      else {
        *(undefined4 *)(lVar31 + lVar45 * 4) = *(undefined4 *)(lVar42 + lVar45 * 4);
      }
LAB_00167f3b:
      iVar14 = (int)uVar11;
      uVar11 = (ulong)(iVar14 + 2U);
    } while ((int)(iVar14 + 2U) < local_a8);
  }
  iVar14 = (int)uVar11;
  lVar43 = (long)iVar14;
  if (local_a8 < iVar14) {
    if (*(char *)(lVar6 + lVar43) == '\0') {
LAB_0016826d:
      *(undefined4 *)(lVar31 + lVar43 * 4) = 0;
      return;
    }
  }
  else {
    if (*(char *)(lVar6 + lVar43) == '\0') {
LAB_00168240:
      iVar14 = (int)uVar11;
      lVar43 = (long)iVar14;
      if (*(char *)(lVar6 + 1 + lVar43) == '\0') goto LAB_0016826d;
    }
    lVar43 = (long)iVar14;
    if (*(char *)(lVar46 + 1 + lVar43) != '\0') goto LAB_0016825f;
  }
  lVar43 = (long)iVar14;
  cVar1 = *(char *)(lVar46 + lVar43);
joined_r0x001680ef:
  if (cVar1 == '\0') {
    RemSP::P_[RemSP::length_] = RemSP::length_;
    uVar25 = RemSP::length_ + 1;
    *(uint *)(lVar31 + lVar43 * 4) = RemSP::length_;
    RemSP::length_ = uVar25;
    return;
  }
LAB_0016825f:
  uVar12 = *(undefined4 *)(lVar42 + lVar43 * 4);
LAB_00168264:
  *(undefined4 *)(lVar31 + lVar43 * 4) = uVar12;
  return;
LAB_001642c5:
  uVar12 = 0;
LAB_001642da:
  *(undefined4 *)(lVar31 + lVar29 * 4) = uVar12;
  uVar26 = uVar25;
LAB_001642de:
  uVar25 = uVar26 + 2;
  if (iVar14 <= (int)uVar25) goto LAB_001642ec;
  goto LAB_00164233;
code_r0x00164492:
  uVar11 = lVar37 + lVar39 & 0xffffffff;
  goto LAB_001643db;
LAB_0016609a:
  *(undefined4 *)(lVar32 + lVar39 + 8 + lVar22 * 4) = *(undefined4 *)(lVar40 + lVar34);
  local_b0 = (ulong)(uint)(iVar28 + iVar13);
LAB_00166537:
  lVar21 = (long)(int)local_b0;
  local_b0 = lVar21 + 2;
  if (local_a8 <= (int)local_b0) {
    uVar11 = local_b0 & 0xffffffff;
    if (local_a8 < (int)local_b0) {
      if (*(char *)(lVar37 + uVar11) == '\0') {
LAB_001665d2:
        iVar14 = (int)local_b0;
        local_b0 = local_b0 & 0xffffffff;
        if (*(char *)(lVar19 + local_b0) == '\0') goto LAB_00166e59;
LAB_001665df:
        local_b0 = (ulong)iVar14;
        if (*(char *)(lVar19 + -1 + local_b0) != '\0') goto LAB_00166d84;
        goto LAB_00166e36;
      }
      uVar36 = local_b0;
      if (*(char *)(lVar19 + 1 + lVar21) == '\0') goto LAB_00164811;
    }
    else {
      if (*(char *)(lVar37 + uVar11) == '\0') {
        if (*(char *)(lVar19 + uVar11) == '\0') goto LAB_00166e1b;
        if (*(char *)(lVar37 + 3 + lVar21) == '\0') {
LAB_0016679e:
          iVar14 = (int)local_b0;
          goto LAB_001665df;
        }
      }
      if (*(char *)(lVar19 + 1 + lVar21) == '\0') {
LAB_00166644:
        uVar35 = (uint)local_b0;
        goto LAB_001647ae;
      }
      if (*(char *)(lVar27 + 3 + lVar21) != '\0') {
        if (*(char *)(lVar27 + lVar21) == '\0') {
LAB_00165827:
          uVar35 = *(uint *)(lVar24 + uVar11 * 4);
          uVar5 = *(uint *)(lVar40 + lVar21 * 4);
          goto LAB_00166762;
        }
LAB_00166619:
        uVar35 = (uint)local_b0;
        if (*(char *)(lVar20 + -1 + (long)(int)uVar35) != '\0') goto LAB_00166d6e;
        uVar11 = local_b0 & 0xffffffff;
        uVar5 = *(uint *)(lVar24 + uVar11 * 4);
        uVar35 = *(uint *)(lVar40 + -8 + (long)(int)uVar35 * 4);
        goto LAB_00165333;
      }
    }
    if (*(char *)(lVar27 + uVar11) != '\0') goto LAB_00166729;
LAB_00166747:
    *(undefined4 *)(lVar40 + uVar11 * 4) = *(undefined4 *)(lVar40 + lVar21 * 4);
    goto LAB_00166e66;
  }
  if (*(char *)(lVar37 + local_b0) == '\0') {
    if (*(char *)(lVar19 + local_b0) == '\0') goto LAB_00166704;
    uVar11 = local_b0;
    if (*(char *)(lVar21 + 3 + lVar37) == '\0') goto LAB_00165096;
    if (*(char *)(lVar19 + 1 + lVar21) == '\0') goto LAB_001648f0;
    if (*(char *)(lVar27 + 3 + lVar21) != '\0') {
      if (*(char *)(lVar27 + lVar21) != '\0') goto LAB_0016669e;
      uVar35 = RemSP::Merge(*(uint *)(lVar24 + 8 + lVar21 * 4),*(uint *)(lVar40 + lVar21 * 4));
      *(uint *)(lVar40 + 8 + lVar21 * 4) = uVar35;
      goto LAB_001663cb;
    }
  }
  else {
    uVar11 = local_b0;
    if (*(char *)(lVar19 + 1 + lVar21) == '\0') goto LAB_001647e5;
    if (*(char *)(lVar21 + 3 + lVar27) != '\0') {
      if (*(char *)(lVar27 + lVar21) == '\0') {
        uVar35 = RemSP::Merge(*(uint *)(lVar24 + 8 + lVar21 * 4),*(uint *)(lVar40 + lVar21 * 4));
        *(uint *)(lVar40 + 8 + lVar21 * 4) = uVar35;
        goto LAB_00166bb5;
      }
LAB_0016656f:
      lVar21 = (long)(int)local_b0;
      if (*(char *)(lVar20 + -1 + lVar21) == '\0') {
        uVar35 = *(uint *)(lVar24 + lVar21 * 4);
        goto LAB_0016658b;
      }
LAB_00166465:
      lVar21 = (long)(int)local_b0;
      if (*(char *)(lVar27 + lVar21) != '\0') goto LAB_00166ffc;
      cVar1 = *(char *)(lVar20 + lVar21);
      uVar35 = *(uint *)(lVar24 + lVar21 * 4);
      goto joined_r0x0016647f;
    }
    if (*(char *)(lVar37 + 3 + lVar21) == '\0') {
      if (*(char *)(lVar27 + local_b0) == '\0') goto LAB_001668ea;
      if (*(char *)(lVar27 + lVar21) != '\0') goto LAB_001668c5;
      uVar35 = RemSP::Merge(*(uint *)(lVar24 + 8 + lVar21 * 4),*(uint *)(lVar40 + lVar21 * 4));
      *(uint *)(lVar40 + 8 + lVar21 * 4) = uVar35;
      goto LAB_00165647;
    }
  }
  if (*(char *)(lVar21 + 4 + lVar27) == '\0') {
    if (*(char *)(lVar27 + 2 + lVar21) == '\0') goto LAB_0016692c;
    if (*(char *)(lVar27 + lVar21) == '\0') {
      uVar35 = RemSP::Merge(*(uint *)(lVar24 + 8 + lVar21 * 4),*(uint *)(lVar40 + lVar21 * 4));
      *(uint *)(lVar40 + 8 + lVar21 * 4) = uVar35;
      goto LAB_00164950;
    }
LAB_00166910:
    lVar21 = (long)(int)local_b0;
    uVar35 = *(uint *)(lVar24 + lVar21 * 4);
    if (*(char *)(lVar20 + -1 + lVar21) == '\0') {
      uVar35 = RemSP::Merge(uVar35,*(uint *)(lVar40 + -8 + lVar21 * 4));
      *(uint *)(lVar40 + lVar21 * 4) = uVar35;
    }
    else {
      *(uint *)(lVar40 + lVar21 * 4) = uVar35;
    }
LAB_00164950:
    lVar21 = (long)(int)local_b0;
    local_b0 = lVar21 + 2;
    if (local_a8 <= (int)local_b0) {
      uVar11 = local_b0;
      if (local_a8 < (int)local_b0) goto LAB_00166406;
      uVar11 = local_b0 & 0xffffffff;
      if (*(char *)(lVar37 + uVar11) == '\0') {
        if (*(char *)(lVar19 + uVar11) == '\0') goto LAB_0016600d;
        if (*(char *)(lVar37 + 3 + lVar21) == '\0') goto LAB_00166747;
      }
      if (*(char *)(lVar27 + 3 + lVar21) == '\0') goto LAB_00166747;
      if (*(char *)(lVar20 + uVar11) != '\0') goto LAB_00166733;
      goto LAB_00165827;
    }
    if (*(char *)(lVar37 + local_b0) == '\0') {
      if (*(char *)(lVar19 + local_b0) == '\0') goto LAB_0016597b;
      if (*(char *)(lVar21 + 3 + lVar37) == '\0') goto LAB_0016592a;
      if (*(char *)(lVar27 + 3 + lVar21) != '\0') {
        if (*(char *)(lVar20 + local_b0) == '\0') {
          uVar35 = RemSP::Merge(*(uint *)(lVar24 + 8 + lVar21 * 4),*(uint *)(lVar40 + lVar21 * 4));
          *(uint *)(lVar40 + 8 + lVar21 * 4) = uVar35;
          goto LAB_001663cb;
        }
LAB_001661bd:
        lVar21 = (long)(int)local_b0;
        uVar35 = *(uint *)(lVar24 + lVar21 * 4);
        if (*(char *)(lVar20 + -1 + lVar21) != '\0') goto LAB_001670a9;
LAB_00164eeb:
        uVar35 = RemSP::Merge(uVar35,*(uint *)(lVar40 + -8 + lVar21 * 4));
LAB_00166f4a:
        *(uint *)(lVar40 + lVar21 * 4) = uVar35;
LAB_001663cb:
        lVar21 = (long)(int)local_b0;
        local_b0 = lVar21 + 2;
        if (local_a8 <= (int)local_b0) {
          if (local_a8 < (int)local_b0) {
            uVar11 = local_b0 & 0xffffffff;
            goto LAB_00166406;
          }
          uVar11 = local_b0 & 0xffffffff;
          if (*(char *)(lVar37 + uVar11) != '\0') goto LAB_00166d64;
          uVar30 = local_b0;
          if (*(char *)(lVar19 + uVar11) == '\0') goto LAB_00166e18;
          if (*(char *)(lVar37 + 3 + lVar21) != '\0') goto LAB_00166d64;
          *(undefined4 *)(lVar40 + uVar11 * 4) = *(undefined4 *)(lVar40 + lVar21 * 4);
          goto LAB_00166e66;
        }
        if (*(char *)(lVar37 + local_b0) == '\0') {
          if (*(char *)(lVar19 + local_b0) == '\0') goto LAB_001648df;
          if (*(char *)(lVar37 + 3 + lVar21) == '\0') {
            *(undefined4 *)(lVar40 + 8 + lVar21 * 4) = *(undefined4 *)(lVar40 + lVar21 * 4);
LAB_00165102:
            lVar21 = (long)(int)local_b0;
            local_b0 = lVar21 + 2;
            if ((int)local_b0 < local_a8) {
              if (*(char *)(lVar37 + local_b0) == '\0') {
                local_b0 = local_b0 & 0xffffffff;
                goto LAB_00164ec2;
              }
              if (*(char *)(lVar19 + 1 + lVar21) == '\0') goto LAB_00164c9e;
LAB_0016512d:
              lVar21 = (long)(int)local_b0;
              if (*(char *)(lVar21 + 1 + lVar27) != '\0') {
                if ((*(char *)(lVar27 + lVar21) == '\0') &&
                   (*(char *)(lVar27 + -1 + lVar21) != '\0')) {
                  if (*(char *)(lVar20 + lVar21) == '\0') {
                    uVar35 = RemSP::Merge(*(uint *)(lVar24 + -8 + lVar21 * 4),
                                          *(uint *)(lVar24 + lVar21 * 4));
                    uVar35 = RemSP::Merge(uVar35,*(uint *)(lVar40 + -8 + lVar21 * 4));
                  }
                  else {
                    uVar35 = RemSP::Merge(*(uint *)(lVar24 + lVar21 * 4),
                                          *(uint *)(lVar40 + -8 + lVar21 * 4));
                  }
                  *(uint *)(lVar40 + lVar21 * 4) = uVar35;
                }
                else {
                  uVar35 = RemSP::Merge(*(uint *)(lVar24 + lVar21 * 4),
                                        *(uint *)(lVar40 + -8 + lVar21 * 4));
                  *(uint *)(lVar40 + lVar21 * 4) = uVar35;
                }
                goto LAB_00166bb5;
              }
              if (*(char *)(lVar37 + 1 + lVar21) == '\0') {
                if (*(char *)(lVar27 + -1 + lVar21) == '\0') {
                  local_b0 = local_b0 & 0xffffffff;
                  goto LAB_0016552b;
                }
                uVar35 = RemSP::Merge(*(uint *)(lVar24 + -8 + lVar21 * 4),
                                      *(uint *)(lVar40 + -8 + lVar21 * 4));
                *(uint *)(lVar40 + lVar21 * 4) = uVar35;
                goto LAB_00166537;
              }
              if (*(char *)(lVar21 + 2 + lVar27) == '\0') {
                if (*(char *)(lVar27 + -1 + lVar21) == '\0') {
LAB_00164fcc:
                  lVar21 = (long)(int)local_b0;
                  if (*(char *)(lVar27 + lVar21) == '\0') {
                    *(undefined4 *)(lVar40 + lVar21 * 4) = *(undefined4 *)(lVar40 + -8 + lVar21 * 4)
                    ;
LAB_00165781:
                    do {
                      lVar21 = (long)(int)local_b0;
                      local_b0 = lVar21 + 2;
                      if (local_a8 <= (int)local_b0) {
                        uVar11 = local_b0;
                        if (local_a8 < (int)local_b0) goto LAB_00166406;
                        uVar11 = local_b0 & 0xffffffff;
                        if (*(char *)(lVar37 + uVar11) == '\0') {
                          if (*(char *)(lVar19 + uVar11) == '\0') goto LAB_0016600d;
                          if (*(char *)(lVar37 + 3 + lVar21) == '\0') goto LAB_00166747;
                        }
                        if (*(char *)(lVar27 + 3 + lVar21) == '\0') goto LAB_00166747;
                        goto LAB_00165827;
                      }
                      if (*(char *)(lVar37 + local_b0) != '\0') {
                        if (*(char *)(lVar21 + 3 + lVar27) != '\0') {
                          uVar35 = RemSP::Merge(*(uint *)(lVar24 + 8 + lVar21 * 4),
                                                *(uint *)(lVar40 + lVar21 * 4));
                          *(uint *)(lVar40 + 8 + lVar21 * 4) = uVar35;
                          goto LAB_00166bb5;
                        }
                        if (*(char *)(lVar37 + 3 + lVar21) == '\0') {
                          *(undefined4 *)(lVar40 + 8 + lVar21 * 4) =
                               *(undefined4 *)(lVar40 + lVar21 * 4);
                          local_b0 = local_b0 & 0xffffffff;
                          goto LAB_00166537;
                        }
LAB_001658b9:
                        if (*(char *)(lVar21 + 4 + lVar27) == '\0') {
                          *(undefined4 *)(lVar40 + 8 + lVar21 * 4) =
                               *(undefined4 *)(lVar40 + lVar21 * 4);
                          local_b0 = local_b0 & 0xffffffff;
                          goto LAB_00165df1;
                        }
                        uVar35 = RemSP::Merge(*(uint *)(lVar24 + 0x10 + lVar21 * 4),
                                              *(uint *)(lVar40 + lVar21 * 4));
                        *(uint *)(lVar40 + 8 + lVar21 * 4) = uVar35;
                        goto LAB_001659f1;
                      }
                      if (*(char *)(lVar19 + local_b0) != '\0') {
                        if (*(char *)(lVar21 + 3 + lVar37) == '\0') goto LAB_0016592a;
                        if (*(char *)(lVar27 + 3 + lVar21) == '\0') goto LAB_001658b9;
                        uVar35 = RemSP::Merge(*(uint *)(lVar24 + 8 + lVar21 * 4),
                                              *(uint *)(lVar40 + lVar21 * 4));
                        *(uint *)(lVar40 + 8 + lVar21 * 4) = uVar35;
                        goto LAB_001663cb;
                      }
LAB_0016597b:
                      lVar21 = (long)(int)local_b0;
                      if (*(char *)(lVar21 + 1 + lVar37) != '\0') {
                        if (*(char *)(lVar27 + 1 + lVar21) != '\0') goto LAB_001648fa;
                        if (*(char *)(lVar21 + 2 + lVar27) == '\0') goto LAB_001659b1;
                        *(undefined4 *)(lVar40 + lVar21 * 4) =
                             *(undefined4 *)(lVar24 + 8 + lVar21 * 4);
                        local_b0 = local_b0 & 0xffffffff;
                        goto LAB_001659f1;
                      }
                      local_b0 = local_b0 & 0xffffffff;
LAB_00164b64:
                      lVar21 = (long)(int)local_b0;
                      if (*(char *)(lVar19 + 1 + lVar21) != '\0') {
                        RemSP::P_[RemSP::length_] = RemSP::length_;
                        uVar35 = RemSP::length_;
                        uVar5 = RemSP::length_ + 1;
                        *(uint *)(lVar40 + lVar21 * 4) = RemSP::length_;
                        RemSP::length_ = uVar5;
                        local_b0 = lVar21 + 2;
                        if ((int)local_b0 < local_a8) {
                          if (*(char *)(lVar37 + local_b0) != '\0') goto LAB_0016512d;
                          if (*(char *)(lVar19 + local_b0) == '\0') goto LAB_00164f47;
                          if (*(char *)(lVar37 + 3 + lVar21) != '\0') goto LAB_00164edd;
                          *(uint *)(lVar40 + 8 + lVar21 * 4) = uVar35;
                          local_b0 = local_b0 & 0xffffffff;
                          goto LAB_00165102;
                        }
                        uVar36 = local_b0 & 0xffffffff;
                        if (local_a8 < (int)local_b0) {
                          uVar11 = local_b0;
                          if (*(char *)(lVar37 + uVar36) != '\0') goto LAB_00165229;
                          goto LAB_00166413;
                        }
                        if (*(char *)(lVar37 + uVar36) != '\0') {
                          local_b0 = local_b0 & 0xffffffff;
                          goto LAB_001651df;
                        }
                        if (*(char *)(lVar19 + uVar36) == '\0') goto LAB_00166e1b;
                        if (*(char *)(lVar37 + 3 + lVar21) != '\0') goto LAB_00165317;
                        *(uint *)(lVar40 + uVar36 * 4) = uVar35;
                        goto LAB_00166e66;
                      }
                      *(undefined4 *)(lVar40 + lVar21 * 4) = 0;
                      uVar30 = lVar21 + 2;
                      if (local_a8 <= (int)uVar30) {
                        cVar1 = *(char *)(lVar37 + (uVar30 & 0xffffffff));
                        if ((int)uVar30 <= local_a8) {
                          if (cVar1 != '\0') goto LAB_00165296;
                          goto LAB_00164c5a;
                        }
                        if (cVar1 != '\0') goto LAB_001652bf;
                        goto LAB_00164c09;
                      }
                      local_b0 = uVar30;
                      if (*(char *)(lVar37 + uVar30) == '\0') {
LAB_00164885:
                        lVar21 = (long)(int)local_b0;
                        if (*(char *)(lVar19 + lVar21) != '\0') {
                          if (*(char *)(lVar37 + 1 + lVar21) == '\0') {
                            RemSP::P_[RemSP::length_] = RemSP::length_;
                            uVar35 = RemSP::length_;
                            goto LAB_001650fe;
                          }
                          uVar11 = local_b0 & 0xffffffff;
                          goto LAB_001648f0;
                        }
                        goto LAB_001648df;
                      }
LAB_00164c9e:
                      lVar21 = (long)(int)local_b0;
                      if (*(char *)(lVar21 + 1 + lVar27) != '\0') {
                        if ((*(char *)(lVar27 + lVar21) != '\0') ||
                           (*(char *)(lVar27 + -1 + lVar21) == '\0')) {
                          *(undefined4 *)(lVar40 + lVar21 * 4) =
                               *(undefined4 *)(lVar24 + lVar21 * 4);
                          local_b0 = local_b0 & 0xffffffff;
                          goto LAB_00166bb5;
                        }
                        local_b0 = local_b0 & 0xffffffff;
                        goto LAB_00166fee;
                      }
                      if (*(char *)(lVar37 + 1 + lVar21) != '\0') {
                        if (*(char *)(lVar27 + 2 + lVar21) != '\0') {
                          if (*(char *)(lVar27 + lVar21) != '\0') goto LAB_00164924;
                          if (*(char *)(lVar27 + -1 + lVar21) != '\0') goto LAB_0016722f;
                          goto LAB_00164cec;
                        }
                        if (*(char *)(lVar27 + lVar21) != '\0') goto LAB_00164948;
                        if (*(char *)(lVar27 + -1 + lVar21) == '\0') goto LAB_00164d3a;
                        *(undefined4 *)(lVar40 + lVar21 * 4) =
                             *(undefined4 *)(lVar24 + -8 + lVar21 * 4);
                        goto LAB_00165781;
                      }
                      if (*(char *)(lVar27 + lVar21) == '\0') {
                        if (*(char *)(lVar27 + -1 + lVar21) == '\0') {
                          RemSP::P_[RemSP::length_] = RemSP::length_;
                          uVar35 = RemSP::length_ + 1;
                          *(uint *)(lVar40 + lVar21 * 4) = RemSP::length_;
                          RemSP::length_ = uVar35;
                          local_b0 = local_b0 & 0xffffffff;
                          goto LAB_00164dc9;
                        }
                        *(undefined4 *)(lVar40 + lVar21 * 4) =
                             *(undefined4 *)(lVar24 + -8 + lVar21 * 4);
                        local_b0 = local_b0 & 0xffffffff;
                        goto LAB_00164dc9;
                      }
                      *(undefined4 *)(lVar40 + lVar21 * 4) = *(undefined4 *)(lVar24 + lVar21 * 4);
                      local_b0 = local_b0 & 0xffffffff;
LAB_00165647:
                      while( true ) {
                        lVar21 = (long)(int)local_b0;
                        local_b0 = lVar21 + 2;
                        if (local_a8 <= (int)local_b0) {
                          uVar11 = local_b0 & 0xffffffff;
                          if (local_a8 < (int)local_b0) {
                            if (*(char *)(lVar37 + uVar11) == '\0') goto LAB_001665d2;
                            uVar36 = local_b0;
                            if (*(char *)(lVar19 + 1 + lVar21) == '\0') goto LAB_00164811;
                          }
                          else {
                            if (*(char *)(lVar37 + uVar11) == '\0') {
                              if (*(char *)(lVar19 + uVar11) == '\0') goto LAB_00166e1b;
                              if (*(char *)(lVar37 + 3 + lVar21) == '\0') goto LAB_0016679e;
                            }
                            if (*(char *)(lVar19 + 1 + lVar21) == '\0') goto LAB_00166644;
                            if (*(char *)(lVar27 + 3 + lVar21) != '\0') goto LAB_00166619;
                          }
                          if (*(char *)(lVar27 + uVar11) != '\0') goto LAB_00166733;
                          *(undefined4 *)(lVar40 + uVar11 * 4) =
                               *(undefined4 *)(lVar40 + lVar21 * 4);
                          goto LAB_00166e66;
                        }
                        if (*(char *)(lVar37 + local_b0) == '\0') break;
                        uVar11 = local_b0;
                        if (*(char *)(lVar19 + 1 + lVar21) == '\0') goto LAB_001647e5;
                        if (*(char *)(lVar21 + 3 + lVar27) != '\0') goto LAB_0016656f;
                        if (*(char *)(lVar37 + 3 + lVar21) != '\0') goto LAB_00165718;
                        if (*(char *)(lVar27 + local_b0) == '\0') {
LAB_001668ea:
                          *(undefined4 *)(lVar40 + 8 + lVar21 * 4) =
                               *(undefined4 *)(lVar40 + lVar21 * 4);
LAB_00164dc9:
                          while( true ) {
                            lVar21 = (long)(int)local_b0;
                            local_b0 = lVar21 + 2;
                            if (local_a8 <= (int)local_b0) {
                              cVar1 = *(char *)(lVar37 + (local_b0 & 0xffffffff));
                              if ((int)local_b0 <= local_a8) {
                                if (cVar1 != '\0') goto LAB_00165306;
                                goto LAB_001652eb;
                              }
                              if (cVar1 == '\0') goto LAB_001665d2;
                              uVar36 = local_b0;
                              if (*(char *)(lVar19 + 1 + lVar21) != '\0') goto LAB_00165321;
                              goto LAB_00164811;
                            }
                            if (*(char *)(lVar37 + local_b0) == '\0') goto LAB_00164ec2;
                            uVar11 = local_b0;
                            if (*(char *)(lVar19 + 1 + lVar21) == '\0') goto LAB_001647e5;
                            if (*(char *)(lVar21 + 3 + lVar27) != '\0') {
                              uVar35 = RemSP::Merge(*(uint *)(lVar24 + 8 + lVar21 * 4),
                                                    *(uint *)(lVar40 + lVar21 * 4));
                              *(uint *)(lVar40 + 8 + lVar21 * 4) = uVar35;
                              goto LAB_00166bb5;
                            }
                            if (*(char *)(lVar37 + 3 + lVar21) != '\0') goto LAB_00164f57;
LAB_0016552b:
                            lVar21 = (long)(int)local_b0;
                            if (*(char *)(lVar27 + lVar21) != '\0') break;
                            *(undefined4 *)(lVar40 + lVar21 * 4) =
                                 *(undefined4 *)(lVar40 + -8 + lVar21 * 4);
                          }
                          uVar35 = *(uint *)(lVar24 + lVar21 * 4);
LAB_001655fd:
                          uVar35 = RemSP::Merge(uVar35,*(uint *)(lVar40 + -8 + lVar21 * 4));
                          *(uint *)(lVar40 + lVar21 * 4) = uVar35;
                        }
                        else {
LAB_001668c5:
                          lVar21 = (long)(int)local_b0;
                          uVar35 = *(uint *)(lVar24 + lVar21 * 4);
                          if (*(char *)(lVar20 + -1 + lVar21) == '\0') goto LAB_001655fd;
                          *(uint *)(lVar40 + lVar21 * 4) = uVar35;
                        }
                      }
                      if (*(char *)(lVar19 + local_b0) == '\0') {
LAB_00166704:
                        local_b0 = local_b0 & 0xffffffff;
                        goto LAB_001648df;
                      }
                      uVar11 = local_b0;
                      if (*(char *)(lVar21 + 3 + lVar37) == '\0') goto LAB_00165096;
                      if (*(char *)(lVar19 + 1 + lVar21) == '\0') goto LAB_001648f0;
                      if (*(char *)(lVar27 + 3 + lVar21) != '\0') goto LAB_0016669e;
LAB_00165718:
                      if (*(char *)(lVar21 + 4 + lVar27) != '\0') {
                        if (*(char *)(lVar20 + 3 + lVar21) != '\0') goto LAB_001667dc;
                        if (*(char *)(lVar27 + local_b0) != '\0') goto LAB_001669a4;
                        goto LAB_00166a77;
                      }
                      if (*(char *)(lVar27 + local_b0) != '\0') goto LAB_00166910;
LAB_0016692c:
                      *(undefined4 *)(lVar40 + 8 + lVar21 * 4) =
                           *(undefined4 *)(lVar40 + lVar21 * 4);
                      local_b0 = local_b0 & 0xffffffff;
                    } while( true );
                  }
                  uVar35 = RemSP::Merge(*(uint *)(lVar24 + lVar21 * 4),
                                        *(uint *)(lVar40 + -8 + lVar21 * 4));
                  *(uint *)(lVar40 + lVar21 * 4) = uVar35;
                  goto LAB_00164950;
                }
                uVar35 = RemSP::Merge(*(uint *)(lVar24 + -8 + lVar21 * 4),
                                      *(uint *)(lVar40 + -8 + lVar21 * 4));
                *(uint *)(lVar40 + lVar21 * 4) = uVar35;
                goto LAB_00165df1;
              }
              if (*(char *)(lVar27 + lVar21) != '\0') {
                cVar1 = *(char *)(lVar20 + 1 + lVar21);
                goto joined_r0x0016528b;
              }
              if (*(char *)(lVar27 + -1 + lVar21) == '\0') {
                uVar35 = *(uint *)(lVar24 + 8 + lVar21 * 4);
                goto LAB_00166807;
              }
              if (*(char *)(lVar20 + 1 + lVar21) == '\0') {
                uVar35 = RemSP::Merge(*(uint *)(lVar24 + -8 + lVar21 * 4),
                                      *(uint *)(lVar24 + 8 + lVar21 * 4));
                uVar35 = RemSP::Merge(uVar35,*(uint *)(lVar40 + -8 + lVar21 * 4));
                *(uint *)(lVar40 + lVar21 * 4) = uVar35;
                goto LAB_001659f1;
              }
              if (*(char *)(lVar20 + lVar21) != '\0') goto LAB_001669cb;
              uVar35 = *(uint *)(lVar24 + -8 + lVar21 * 4);
              goto LAB_001669dd;
            }
            cVar1 = *(char *)(lVar37 + (local_b0 & 0xffffffff));
            uVar30 = local_b0;
            if (local_a8 < (int)local_b0) {
              if (cVar1 == '\0') {
                local_b0 = local_b0 & 0xffffffff;
                goto LAB_001665d2;
              }
              local_b0 = local_b0 & 0xffffffff;
              if (*(char *)(lVar19 + 1 + lVar21) == '\0') {
LAB_001652bf:
                local_b0 = (ulong)(int)uVar30;
                if (*(char *)(lVar27 + local_b0) != '\0') goto LAB_0016481e;
                if (*(char *)(lVar27 + -1 + local_b0) == '\0') goto LAB_00166e36;
                uVar12 = *(undefined4 *)(lVar24 + -8 + local_b0 * 4);
                goto LAB_00166d89;
              }
LAB_00165229:
              uVar11 = (ulong)(int)local_b0;
              if (*(char *)(lVar27 + -1 + uVar11) != '\0') {
                uVar5 = *(uint *)(lVar24 + -8 + uVar11 * 4);
                goto LAB_0016532e;
              }
LAB_00165321:
              uVar11 = (ulong)(int)local_b0;
              if (*(char *)(lVar27 + uVar11) == '\0') {
                uVar12 = *(undefined4 *)(lVar40 + -8 + uVar11 * 4);
                goto LAB_00166d7b;
              }
            }
            else {
              if (cVar1 != '\0') {
                if (*(char *)(lVar19 + 1 + lVar21) == '\0') {
LAB_00165296:
                  uVar35 = (uint)uVar30;
                  local_b0 = (ulong)(int)uVar35;
                  if (*(char *)(lVar27 + 1 + local_b0) == '\0') goto LAB_001652bf;
                  if ((*(char *)(lVar27 + local_b0) != '\0') ||
                     (*(char *)(lVar27 + -1 + local_b0) == '\0')) goto LAB_0016481e;
                  goto LAB_00167106;
                }
LAB_001651df:
                lVar37 = (long)(int)local_b0;
                local_b0 = local_b0 & 0xffffffff;
                if (*(char *)(lVar27 + 1 + lVar37) == '\0') goto LAB_00165229;
                if (*(char *)(lVar27 + lVar37) == '\0') {
                  if (*(char *)(lVar27 + -1 + lVar37) == '\0') {
                    uVar35 = RemSP::Merge(*(uint *)(lVar24 + lVar37 * 4),
                                          *(uint *)(lVar40 + -8 + lVar37 * 4));
                    *(uint *)(lVar40 + lVar37 * 4) = uVar35;
                  }
                  else {
                    if (*(char *)(lVar20 + lVar37) == '\0') {
                      uVar35 = RemSP::Merge(*(uint *)(lVar24 + -8 + lVar37 * 4),
                                            *(uint *)(lVar24 + lVar37 * 4));
                      uVar5 = *(uint *)(lVar40 + -8 + lVar37 * 4);
                    }
                    else {
                      uVar35 = *(uint *)(lVar24 + lVar37 * 4);
                      uVar5 = *(uint *)(lVar40 + -8 + lVar37 * 4);
                    }
                    uVar35 = RemSP::Merge(uVar35,uVar5);
                    *(uint *)(lVar40 + lVar37 * 4) = uVar35;
                  }
                }
                else {
                  uVar35 = RemSP::Merge(*(uint *)(lVar24 + lVar37 * 4),
                                        *(uint *)(lVar40 + -8 + lVar37 * 4));
                  *(uint *)(lVar40 + lVar37 * 4) = uVar35;
                }
                goto LAB_00166e66;
              }
              local_b0 = local_b0 & 0xffffffff;
LAB_001652eb:
              iVar14 = (int)local_b0;
              if (*(char *)(lVar19 + (local_b0 & 0xffffffff)) == '\0') goto LAB_00166e1b;
              if (*(char *)(lVar37 + 1 + (long)iVar14) == '\0') goto LAB_001665df;
LAB_00165306:
              uVar35 = (uint)local_b0;
              if (*(char *)(lVar19 + -1 + (long)(int)uVar35) == '\0') goto LAB_001647ae;
LAB_00165317:
              uVar11 = (ulong)(int)local_b0;
              if (*(char *)(lVar27 + 1 + uVar11) == '\0') goto LAB_00165321;
            }
            uVar5 = *(uint *)(lVar24 + uVar11 * 4);
            goto LAB_0016532e;
          }
LAB_00166f23:
          uVar11 = local_b0 & 0xffffffff;
          if (*(char *)(lVar27 + 1 + (long)(int)local_b0) != '\0') goto LAB_00166f34;
          goto LAB_00166499;
        }
LAB_00166458:
        lVar21 = (long)(int)local_b0;
        if (*(char *)(lVar21 + 1 + lVar27) != '\0') {
          local_b0 = local_b0 & 0xffffffff;
          goto LAB_00166465;
        }
        if (*(char *)(lVar37 + 1 + lVar21) != '\0') goto LAB_00166499;
        *(undefined4 *)(lVar40 + lVar21 * 4) = *(undefined4 *)(lVar40 + -8 + lVar21 * 4);
        goto LAB_00166537;
      }
    }
    else {
      if (*(char *)(lVar21 + 3 + lVar27) != '\0') {
        if (*(char *)(lVar20 + local_b0) != '\0') goto LAB_00166079;
        uVar35 = RemSP::Merge(*(uint *)(lVar24 + 8 + lVar21 * 4),*(uint *)(lVar40 + lVar21 * 4));
        *(uint *)(lVar40 + 8 + lVar21 * 4) = uVar35;
        goto LAB_00166bb5;
      }
      if (*(char *)(lVar37 + 3 + lVar21) == '\0') {
        *(undefined4 *)(lVar40 + 8 + lVar21 * 4) = *(undefined4 *)(lVar40 + lVar21 * 4);
        local_b0 = local_b0 & 0xffffffff;
        goto LAB_00166537;
      }
    }
    if (*(char *)(lVar21 + 4 + lVar27) == '\0') {
      *(undefined4 *)(lVar40 + 8 + lVar21 * 4) = *(undefined4 *)(lVar40 + lVar21 * 4);
      local_b0 = local_b0 & 0xffffffff;
      goto LAB_00165df1;
    }
    if ((*(char *)(lVar20 + 3 + lVar21) != '\0') && (*(char *)(lVar20 + local_b0) != '\0'))
    goto LAB_00165fe5;
    uVar35 = RemSP::Merge(*(uint *)(lVar24 + 0x10 + lVar21 * 4),*(uint *)(lVar40 + lVar21 * 4));
    *(uint *)(lVar40 + 8 + lVar21 * 4) = uVar35;
    goto LAB_001659f1;
  }
  if (*(char *)(lVar20 + 3 + lVar21) == '\0') {
    if (*(char *)(lVar27 + local_b0) != '\0') {
      if (*(char *)(lVar27 + lVar21) == '\0') {
        uVar35 = RemSP::Merge(*(uint *)(lVar24 + 8 + lVar21 * 4),
                              *(uint *)(lVar24 + 0x10 + lVar21 * 4));
        uVar35 = RemSP::Merge(uVar35,*(uint *)(lVar40 + lVar21 * 4));
        *(uint *)(lVar40 + 8 + lVar21 * 4) = uVar35;
      }
      else {
LAB_001669a4:
        lVar21 = (long)(int)local_b0;
        cVar1 = *(char *)(lVar20 + -1 + lVar21);
joined_r0x0016528b:
        if (cVar1 == '\0') {
          uVar35 = *(uint *)(lVar24 + lVar21 * 4);
LAB_001669dd:
          uVar35 = RemSP::Merge(uVar35,*(uint *)(lVar24 + 8 + lVar21 * 4));
          uVar5 = *(uint *)(lVar40 + -8 + lVar21 * 4);
        }
        else {
LAB_001669cb:
          uVar35 = *(uint *)(lVar24 + 8 + lVar21 * 4);
          uVar5 = *(uint *)(lVar40 + -8 + lVar21 * 4);
        }
        uVar35 = RemSP::Merge(uVar35,uVar5);
        *(uint *)(lVar40 + lVar21 * 4) = uVar35;
      }
      goto LAB_001659f1;
    }
  }
  else if (*(char *)(lVar27 + lVar21) != '\0') {
LAB_001667dc:
    iVar14 = (int)local_b0;
    local_b0 = local_b0 & 0xffffffff;
    lVar21 = (long)iVar14;
    if (*(char *)(lVar20 + -1 + lVar21) != '\0') goto LAB_001664c4;
LAB_001667fc:
    uVar35 = *(uint *)(lVar24 + 8 + lVar21 * 4);
LAB_00166807:
    uVar5 = *(uint *)(lVar40 + -8 + lVar21 * 4);
LAB_0016680c:
    uVar35 = RemSP::Merge(uVar35,uVar5);
    goto LAB_00166842;
  }
LAB_00166a77:
  uVar35 = RemSP::Merge(*(uint *)(lVar24 + 0x10 + lVar21 * 4),*(uint *)(lVar40 + lVar21 * 4));
  *(uint *)(lVar40 + 8 + lVar21 * 4) = uVar35;
  goto LAB_001659f1;
LAB_001659b1:
  RemSP::P_[RemSP::length_] = RemSP::length_;
  uVar35 = RemSP::length_ + 1;
  *(uint *)(lVar40 + lVar21 * 4) = RemSP::length_;
  RemSP::length_ = uVar35;
  local_b0 = local_b0 & 0xffffffff;
  goto LAB_00165781;
LAB_0016669e:
  lVar21 = (long)(int)local_b0;
  uVar11 = local_b0;
  if (*(char *)(lVar20 + -1 + lVar21) == '\0') {
    uVar35 = RemSP::Merge(*(uint *)(lVar24 + lVar21 * 4),*(uint *)(lVar40 + -8 + lVar21 * 4));
    *(uint *)(lVar40 + lVar21 * 4) = uVar35;
    goto LAB_001663cb;
  }
LAB_00166f34:
  lVar21 = (long)(int)uVar11;
  local_b0 = uVar11;
  if (*(char *)(lVar27 + lVar21) == '\0') {
    uVar35 = *(uint *)(lVar24 + lVar21 * 4);
    if (*(char *)(lVar20 + lVar21) == '\0') goto LAB_00164eeb;
LAB_001670a9:
    *(uint *)(lVar40 + lVar21 * 4) = uVar35;
    goto LAB_001663cb;
  }
  uVar35 = *(uint *)(lVar24 + lVar21 * 4);
  goto LAB_00166f4a;
LAB_00164ec2:
  lVar21 = (long)(int)local_b0;
  if (*(char *)(lVar19 + lVar21) != '\0') {
    uVar11 = local_b0;
    if (*(char *)(lVar37 + 1 + lVar21) == '\0') goto LAB_00165096;
    if (*(char *)(lVar19 + -1 + lVar21) != '\0') {
LAB_00164edd:
      lVar21 = (long)(int)local_b0;
      if (*(char *)(lVar27 + 1 + lVar21) != '\0') {
        uVar35 = *(uint *)(lVar24 + lVar21 * 4);
        goto LAB_00164eeb;
      }
LAB_00164f57:
      lVar21 = (long)(int)local_b0;
      if (*(char *)(lVar21 + 2 + lVar27) == '\0') {
        local_b0 = local_b0 & 0xffffffff;
        goto LAB_00164fcc;
      }
      if (*(char *)(lVar20 + 1 + lVar21) == '\0') {
        if (*(char *)(lVar27 + lVar21) == '\0') {
          uVar5 = *(uint *)(lVar24 + 8 + lVar21 * 4);
          uVar35 = *(uint *)(lVar40 + -8 + lVar21 * 4);
        }
        else {
          uVar5 = RemSP::Merge(*(uint *)(lVar24 + lVar21 * 4),*(uint *)(lVar24 + 8 + lVar21 * 4));
          uVar35 = *(uint *)(lVar40 + -8 + lVar21 * 4);
        }
        uVar35 = RemSP::Merge(uVar5,uVar35);
        *(uint *)(lVar40 + lVar21 * 4) = uVar35;
        local_b0 = local_b0 & 0xffffffff;
      }
      else {
        uVar35 = RemSP::Merge(*(uint *)(lVar24 + 8 + lVar21 * 4),*(uint *)(lVar40 + -8 + lVar21 * 4)
                             );
        *(uint *)(lVar40 + lVar21 * 4) = uVar35;
      }
      goto LAB_001659f1;
    }
    goto LAB_001648f0;
  }
LAB_00164f47:
  local_b0 = local_b0 & 0xffffffff;
LAB_001648df:
  uVar11 = local_b0 & 0xffffffff;
  if (*(char *)(lVar37 + 1 + (long)(int)local_b0) != '\0') goto LAB_001648f0;
  goto LAB_00164b64;
LAB_00165096:
  local_b0 = uVar11 & 0xffffffff;
  lVar21 = (long)(int)uVar11;
  if (*(char *)(lVar19 + -1 + lVar21) == '\0') {
    RemSP::P_[RemSP::length_] = RemSP::length_;
    uVar35 = RemSP::length_;
LAB_001650fe:
    RemSP::length_ = uVar35 + 1;
    *(uint *)(lVar40 + lVar21 * 4) = uVar35;
  }
  else {
    *(undefined4 *)(lVar40 + lVar21 * 4) = *(undefined4 *)(lVar40 + -8 + lVar21 * 4);
  }
  goto LAB_00165102;
LAB_001648f0:
  lVar21 = (long)(int)uVar11;
  local_b0 = uVar11;
  if (*(char *)(lVar27 + 1 + lVar21) != '\0') {
LAB_001648fa:
    *(undefined4 *)(lVar40 + lVar21 * 4) = *(undefined4 *)(lVar24 + lVar21 * 4);
    goto LAB_001663cb;
  }
LAB_00164907:
  iVar14 = (int)local_b0;
  local_b0 = local_b0 & 0xffffffff;
  lVar21 = (long)iVar14;
  if (*(char *)(lVar27 + 2 + lVar21) != '\0') {
    if (*(char *)(lVar27 + lVar21) != '\0') goto LAB_00164924;
LAB_00164cec:
    *(undefined4 *)(lVar40 + lVar21 * 4) = *(undefined4 *)(lVar24 + 8 + lVar21 * 4);
    goto LAB_001659f1;
  }
  if (*(char *)(lVar27 + lVar21) != '\0') {
LAB_00164948:
    *(undefined4 *)(lVar40 + lVar21 * 4) = *(undefined4 *)(lVar24 + lVar21 * 4);
    goto LAB_00164950;
  }
LAB_00164d3a:
  RemSP::P_[RemSP::length_] = RemSP::length_;
  uVar35 = RemSP::length_ + 1;
  *(uint *)(lVar40 + lVar21 * 4) = RemSP::length_;
  RemSP::length_ = uVar35;
  goto LAB_00165781;
LAB_0016722f:
  lVar21 = (long)(int)local_b0;
  if ((*(char *)(lVar20 + 1 + lVar21) == '\0') || (*(char *)(lVar20 + lVar21) == '\0')) {
    uVar35 = RemSP::Merge(*(uint *)(lVar24 + -8 + lVar21 * 4),*(uint *)(lVar24 + 8 + lVar21 * 4));
  }
  else {
    uVar35 = *(uint *)(lVar24 + 8 + lVar21 * 4);
  }
  *(uint *)(lVar40 + lVar21 * 4) = uVar35;
  goto LAB_001659f1;
LAB_0016592a:
  *(undefined4 *)(lVar40 + 8 + lVar21 * 4) = *(undefined4 *)(lVar40 + lVar21 * 4);
  local_b0 = local_b0 & 0xffffffff;
  goto LAB_00165102;
LAB_00166499:
  lVar21 = (long)(int)local_b0;
  if (*(char *)(lVar27 + 2 + lVar21) != '\0') {
LAB_001664ac:
    lVar21 = (long)(int)local_b0;
    if (*(char *)(lVar20 + 1 + lVar21) == '\0') goto LAB_001667fc;
    goto LAB_001664c4;
  }
  *(undefined4 *)(lVar40 + lVar21 * 4) = *(undefined4 *)(lVar40 + -8 + lVar21 * 4);
  goto LAB_00165df1;
LAB_00166079:
  lVar21 = (long)(int)local_b0;
  cVar1 = *(char *)(lVar20 + -1 + lVar21);
  uVar35 = *(uint *)(lVar24 + lVar21 * 4);
joined_r0x0016647f:
  if (cVar1 == '\0') {
LAB_0016658b:
    uVar5 = *(uint *)(lVar40 + -8 + lVar21 * 4);
    goto LAB_0016700e;
  }
  *(uint *)(lVar40 + lVar21 * 4) = uVar35;
  goto LAB_00166bb5;
LAB_001664c4:
  lVar21 = (long)(int)local_b0;
  if (*(char *)(lVar27 + lVar21) != '\0') goto LAB_00164937;
  cVar1 = *(char *)(lVar20 + lVar21);
  uVar35 = *(uint *)(lVar24 + 8 + lVar21 * 4);
joined_r0x00165ffe:
  if (cVar1 == '\0') {
    uVar35 = RemSP::Merge(uVar35,*(uint *)(lVar40 + -8 + lVar21 * 4));
    *(uint *)(lVar40 + lVar21 * 4) = uVar35;
  }
  else {
    *(uint *)(lVar40 + lVar21 * 4) = uVar35;
  }
  goto LAB_001659f1;
LAB_00165fe5:
  lVar21 = (long)(int)local_b0;
  cVar1 = *(char *)(lVar20 + -1 + lVar21);
  uVar35 = *(uint *)(lVar24 + 8 + lVar21 * 4);
  goto joined_r0x00165ffe;
LAB_00166fc7:
  local_b0 = (ulong)(uint)(iVar28 + (int)lVar10);
LAB_00166fee:
  lVar21 = (long)(int)local_b0;
  if (*(char *)(lVar20 + lVar21) == '\0') {
    uVar35 = *(uint *)(lVar24 + -8 + lVar21 * 4);
    uVar5 = *(uint *)(lVar24 + lVar21 * 4);
LAB_0016700e:
    uVar35 = RemSP::Merge(uVar35,uVar5);
  }
  else {
LAB_00166ffc:
    uVar35 = *(uint *)(lVar24 + lVar21 * 4);
  }
  *(uint *)(lVar40 + lVar21 * 4) = uVar35;
  goto LAB_00166bb5;
code_r0x00167959:
  if (*(char *)(lVar37 + lVar32) == '\0') {
    uVar11 = (ulong)(iVar14 + iVar28 + 2);
    *(undefined4 *)(lVar45 + lVar32 * 4) = *(undefined4 *)(lVar31 + (lVar21 >> 0x1e));
    goto LAB_00167abb;
  }
  uVar25 = *(uint *)(lVar19 + lVar32 * 4);
  if (*(char *)(lVar39 + lVar20 + lVar32) == '\0') {
    uVar25 = RemSP::Merge(uVar25,*(uint *)(lVar45 + -8 + lVar32 * 4));
  }
  *(uint *)(lVar45 + lVar32 * 4) = uVar25;
  lVar21 = lVar21 + 0x200000000;
  lVar9 = lVar20 + lVar32;
  lVar32 = lVar32 + 2;
  if (lVar33 <= lVar9 + 4) {
    uVar25 = iVar14 + (int)lVar32 + 2;
    iVar14 = iVar14 + (int)lVar32;
    goto LAB_0016805d;
  }
  goto LAB_00167935;
code_r0x00167d24:
  *(undefined4 *)(lVar20 + lVar21 * 4) = *(undefined4 *)(lVar37 + -8 + lVar21 * 4);
  lVar9 = lVar45 + lVar21;
  lVar21 = lVar21 + 2;
  if (lVar33 <= lVar9 + 2) {
    uVar25 = iVar14 + (int)lVar21 + 2;
    iVar14 = iVar14 + (int)lVar21;
    goto LAB_00168011;
  }
  goto LAB_00167cff;
LAB_001678b3:
  *(undefined4 *)(lVar31 + uVar11 * 4) = *(undefined4 *)(lVar42 + 8 + uVar11 * 4);
  uVar11 = uVar36;
  goto LAB_001678e0;
LAB_00167665:
  uVar25 = *(uint *)(lVar42 + lVar45 * 4);
  uVar26 = *(uint *)(lVar42 + 8 + lVar45 * 4);
  goto LAB_0016766f;
}

Assistant:

void FirstScan()
	{
		const int h = img_.rows;
		const int w = img_.cols;

		e_rows = h & 0xfffffffe;
		o_rows = h % 2 == 1;
		e_cols = w & 0xfffffffe;
		o_cols = w % 2 == 1;

		LabelsSolver::Setup(); // Labels solver initialization

							   // We work with 2x2 blocks
							   // +-+-+-+
							   // |P|Q|R|
							   // +-+-+-+
							   // |S|X|
							   // +-+-+

							   // The pixels are named as follows
							   // +---+---+---+
							   // |a b|c d|e f|
							   // |g h|i j|k l|
							   // +---+---+---+
							   // |m n|o p|
							   // |q r|s t|
							   // +---+---+

							   // Pixels a, f, l, q are not needed, since we need to understand the
							   // the connectivity between these blocks and those pixels only matter
							   // when considering the outer connectivities

							   // A bunch of defines used to check if the pixels are foreground,
							   // without going outside the image limits.

							   // First scan

		// Define Conditions and Actions
		{
#define CONDITION_B img_row_prev_prev[c-1]>0
#define CONDITION_C img_row_prev_prev[c]>0
#define CONDITION_D img_row_prev_prev[c+1]>0
#define CONDITION_E img_row_prev_prev[c+2]>0

#define CONDITION_G img_row_prev[c-2]>0
#define CONDITION_H img_row_prev[c-1]>0
#define CONDITION_I img_row_prev[c]>0
#define CONDITION_J img_row_prev[c+1]>0
#define CONDITION_K img_row_prev[c+2]>0

#define CONDITION_M img_row[c-2]>0
#define CONDITION_N img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P img_row[c+1]>0

#define CONDITION_R img_row_fol[c-1]>0
#define CONDITION_S img_row_fol[c]>0
#define CONDITION_T img_row_fol[c+1]>0

			// Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; 
							   // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); 
							   //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2];
							   // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c];
							   // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2];
							   // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; 
							   // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]);
							   //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]);
							   // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]);
							   // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]);
							   // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]);
							   // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]);
							   // Action 13: Merge labels of block P, Q and R
#define ACTION_13 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row_prev_prev[c + 2]);
							   // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]);
							   //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
							   //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
		}

		if (h == 1) {
			// Single line
			// int r = 0;
			const unsigned char* const img_row = img_.ptr<unsigned char>(0);
			unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
			int c = -2;
#include "labeling_bolelli_2019_forest_sl.inc.h"
		}
		else {
			// More than one line

			// First couple of lines
			{
				// int r = 0;
				const unsigned char* const img_row = img_.ptr<unsigned char>(0);
				const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
				int c = -2;

#include "labeling_bolelli_2019_forest_fl.inc.h"
			}

			// Every other line but the last one if image has an odd number of rows
			for (int r = 2; r < e_rows; r += 2) {
				// Get rows pointer
				const unsigned char* const img_row = img_.ptr<unsigned char>(r);
				const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
				const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
				const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
				unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

				int c = -2;
				goto tree_0;

#include "labeling_bolelli_2019_forest.inc.h"
			}

			// Last line (in case the rows are odd)
			if (o_rows)
			{
				int r = h - 1;
				const unsigned char* const img_row = img_.ptr<unsigned char>(r);
				const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
				const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
				unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);
				int c = -2;
#include "labeling_bolelli_2019_forest_ll.inc.h"
			}
		}


		// Undef Conditions and Actions
		{
#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
		}
	}